

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  byte bVar73;
  byte bVar74;
  ulong uVar75;
  ulong uVar76;
  byte bVar77;
  Primitive *pPVar78;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar79;
  byte bVar80;
  long lVar81;
  byte bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar138;
  uint uVar139;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float pp;
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar167;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar168 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar213 [32];
  float fVar227;
  undefined1 auVar218 [16];
  float fVar217;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar225;
  float fVar226;
  float fVar228;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar230;
  undefined1 auVar229 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  float fVar236;
  undefined1 auVar237 [32];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar238 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [28];
  float fVar245;
  undefined1 auVar246 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_a00 [16];
  uint local_9f0;
  int local_9ec;
  float local_9e8;
  float local_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  RTCFilterFunctionNArguments local_8b0;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  Primitive *local_5f8;
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [16];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCHitN local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  uint local_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint uStack_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar251 [64];
  
  PVar2 = prim[1];
  uVar76 = (ulong)(byte)PVar2;
  lVar81 = uVar76 * 0x19;
  fVar236 = *(float *)(prim + lVar81 + 0x12);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar93 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar92 = vsubps_avx(auVar88,*(undefined1 (*) [16])(prim + lVar81 + 6));
  fVar208 = fVar236 * auVar92._0_4_;
  fVar145 = fVar236 * auVar93._0_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar88);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar95);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar102 = vpmovsxbd_avx2(auVar89);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar103 = vpmovsxbd_avx2(auVar94);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar108 = vpmovsxbd_avx2(auVar86);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar104 = vcvtdq2ps_avx(auVar108);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar76 + 6);
  auVar100 = vpmovsxbd_avx2(auVar218);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar75 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar105 = vpmovsxbd_avx2(auVar90);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar75 + uVar76 + 6);
  auVar106 = vpmovsxbd_avx2(auVar87);
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar83 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar98 = vpmovsxbd_avx2(auVar91);
  auVar107 = vcvtdq2ps_avx(auVar98);
  auVar118._4_4_ = fVar145;
  auVar118._0_4_ = fVar145;
  auVar118._8_4_ = fVar145;
  auVar118._12_4_ = fVar145;
  auVar118._16_4_ = fVar145;
  auVar118._20_4_ = fVar145;
  auVar118._24_4_ = fVar145;
  auVar118._28_4_ = fVar145;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar110 = ZEXT1632(CONCAT412(fVar236 * auVar93._12_4_,
                                CONCAT48(fVar236 * auVar93._8_4_,
                                         CONCAT44(fVar236 * auVar93._4_4_,fVar145))));
  auVar109 = vpermps_avx2(auVar120,auVar110);
  auVar97 = vpermps_avx512vl(auVar96,auVar110);
  fVar145 = auVar97._0_4_;
  fVar239 = auVar97._4_4_;
  auVar110._4_4_ = fVar239 * auVar102._4_4_;
  auVar110._0_4_ = fVar145 * auVar102._0_4_;
  fVar240 = auVar97._8_4_;
  auVar110._8_4_ = fVar240 * auVar102._8_4_;
  fVar241 = auVar97._12_4_;
  auVar110._12_4_ = fVar241 * auVar102._12_4_;
  fVar214 = auVar97._16_4_;
  auVar110._16_4_ = fVar214 * auVar102._16_4_;
  fVar215 = auVar97._20_4_;
  auVar110._20_4_ = fVar215 * auVar102._20_4_;
  fVar216 = auVar97._24_4_;
  auVar110._24_4_ = fVar216 * auVar102._24_4_;
  auVar110._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar100._4_4_ * fVar239;
  auVar108._0_4_ = auVar100._0_4_ * fVar145;
  auVar108._8_4_ = auVar100._8_4_ * fVar240;
  auVar108._12_4_ = auVar100._12_4_ * fVar241;
  auVar108._16_4_ = auVar100._16_4_ * fVar214;
  auVar108._20_4_ = auVar100._20_4_ * fVar215;
  auVar108._24_4_ = auVar100._24_4_ * fVar216;
  auVar108._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar107._4_4_ * fVar239;
  auVar98._0_4_ = auVar107._0_4_ * fVar145;
  auVar98._8_4_ = auVar107._8_4_ * fVar240;
  auVar98._12_4_ = auVar107._12_4_ * fVar241;
  auVar98._16_4_ = auVar107._16_4_ * fVar214;
  auVar98._20_4_ = auVar107._20_4_ * fVar215;
  auVar98._24_4_ = auVar107._24_4_ * fVar216;
  auVar98._28_4_ = auVar97._28_4_;
  auVar88 = vfmadd231ps_fma(auVar110,auVar109,auVar99);
  auVar95 = vfmadd231ps_fma(auVar108,auVar109,auVar104);
  auVar89 = vfmadd231ps_fma(auVar98,auVar106,auVar109);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar118,auVar101);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar118,auVar103);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar105,auVar118);
  auVar119._4_4_ = fVar208;
  auVar119._0_4_ = fVar208;
  auVar119._8_4_ = fVar208;
  auVar119._12_4_ = fVar208;
  auVar119._16_4_ = fVar208;
  auVar119._20_4_ = fVar208;
  auVar119._24_4_ = fVar208;
  auVar119._28_4_ = fVar208;
  auVar98 = ZEXT1632(CONCAT412(fVar236 * auVar92._12_4_,
                               CONCAT48(fVar236 * auVar92._8_4_,
                                        CONCAT44(fVar236 * auVar92._4_4_,fVar208))));
  auVar108 = vpermps_avx2(auVar120,auVar98);
  auVar98 = vpermps_avx512vl(auVar96,auVar98);
  fVar236 = auVar98._0_4_;
  fVar145 = auVar98._4_4_;
  auVar109._4_4_ = fVar145 * auVar102._4_4_;
  auVar109._0_4_ = fVar236 * auVar102._0_4_;
  fVar239 = auVar98._8_4_;
  auVar109._8_4_ = fVar239 * auVar102._8_4_;
  fVar240 = auVar98._12_4_;
  auVar109._12_4_ = fVar240 * auVar102._12_4_;
  fVar241 = auVar98._16_4_;
  auVar109._16_4_ = fVar241 * auVar102._16_4_;
  fVar214 = auVar98._20_4_;
  auVar109._20_4_ = fVar214 * auVar102._20_4_;
  fVar215 = auVar98._24_4_;
  auVar109._24_4_ = fVar215 * auVar102._24_4_;
  auVar109._28_4_ = 1;
  auVar96._4_4_ = auVar100._4_4_ * fVar145;
  auVar96._0_4_ = auVar100._0_4_ * fVar236;
  auVar96._8_4_ = auVar100._8_4_ * fVar239;
  auVar96._12_4_ = auVar100._12_4_ * fVar240;
  auVar96._16_4_ = auVar100._16_4_ * fVar241;
  auVar96._20_4_ = auVar100._20_4_ * fVar214;
  auVar96._24_4_ = auVar100._24_4_ * fVar215;
  auVar96._28_4_ = auVar102._28_4_;
  auVar100._4_4_ = auVar107._4_4_ * fVar145;
  auVar100._0_4_ = auVar107._0_4_ * fVar236;
  auVar100._8_4_ = auVar107._8_4_ * fVar239;
  auVar100._12_4_ = auVar107._12_4_ * fVar240;
  auVar100._16_4_ = auVar107._16_4_ * fVar241;
  auVar100._20_4_ = auVar107._20_4_ * fVar214;
  auVar100._24_4_ = auVar107._24_4_ * fVar215;
  auVar100._28_4_ = auVar98._28_4_;
  auVar94 = vfmadd231ps_fma(auVar109,auVar108,auVar99);
  auVar86 = vfmadd231ps_fma(auVar96,auVar108,auVar104);
  auVar218 = vfmadd231ps_fma(auVar100,auVar108,auVar106);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar119,auVar101);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar119,auVar103);
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar119,auVar105);
  auVar101 = vandps_avx(ZEXT1632(auVar88),auVar115);
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar117._16_4_ = 0x219392ef;
  auVar117._20_4_ = 0x219392ef;
  auVar117._24_4_ = 0x219392ef;
  auVar117._28_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar101,auVar117,1);
  bVar6 = (bool)((byte)uVar75 & 1);
  auVar97._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._0_4_;
  bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._4_4_;
  bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._8_4_;
  bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(ZEXT1632(auVar95),auVar115);
  uVar75 = vcmpps_avx512vl(auVar101,auVar117,1);
  bVar6 = (bool)((byte)uVar75 & 1);
  auVar111._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar95._0_4_;
  bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar95._4_4_;
  bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar95._8_4_;
  bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar95._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(ZEXT1632(auVar89),auVar115);
  uVar75 = vcmpps_avx512vl(auVar101,auVar117,1);
  bVar6 = (bool)((byte)uVar75 & 1);
  auVar101._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._0_4_;
  bVar6 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._4_4_;
  bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._8_4_;
  bVar6 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar89._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar99 = vrcp14ps_avx512vl(auVar97);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = 0x3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar97,auVar99,auVar116);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar111);
  auVar95 = vfnmadd213ps_fma(auVar111,auVar99,auVar116);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar101);
  auVar89 = vfnmadd213ps_fma(auVar101,auVar99,auVar116);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar99,auVar99);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar94));
  auVar105._4_4_ = auVar88._4_4_ * auVar101._4_4_;
  auVar105._0_4_ = auVar88._0_4_ * auVar101._0_4_;
  auVar105._8_4_ = auVar88._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar88._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar101._16_4_ * 0.0;
  auVar105._20_4_ = auVar101._20_4_ * 0.0;
  auVar105._24_4_ = auVar101._24_4_ * 0.0;
  auVar105._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar94));
  auVar100 = vpbroadcastd_avx512vl();
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar114._0_4_ = auVar88._0_4_ * auVar101._0_4_;
  auVar114._4_4_ = auVar88._4_4_ * auVar101._4_4_;
  auVar114._8_4_ = auVar88._8_4_ * auVar101._8_4_;
  auVar114._12_4_ = auVar88._12_4_ * auVar101._12_4_;
  auVar114._16_4_ = auVar101._16_4_ * 0.0;
  auVar114._20_4_ = auVar101._20_4_ * 0.0;
  auVar114._24_4_ = auVar101._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar76 * -2 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar86));
  auVar106._4_4_ = auVar95._4_4_ * auVar101._4_4_;
  auVar106._0_4_ = auVar95._0_4_ * auVar101._0_4_;
  auVar106._8_4_ = auVar95._8_4_ * auVar101._8_4_;
  auVar106._12_4_ = auVar95._12_4_ * auVar101._12_4_;
  auVar106._16_4_ = auVar101._16_4_ * 0.0;
  auVar106._20_4_ = auVar101._20_4_ * 0.0;
  auVar106._24_4_ = auVar101._24_4_ * 0.0;
  auVar106._28_4_ = auVar101._28_4_;
  auVar101 = vcvtdq2ps_avx(auVar99);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar86));
  auVar113._0_4_ = auVar95._0_4_ * auVar101._0_4_;
  auVar113._4_4_ = auVar95._4_4_ * auVar101._4_4_;
  auVar113._8_4_ = auVar95._8_4_ * auVar101._8_4_;
  auVar113._12_4_ = auVar95._12_4_ * auVar101._12_4_;
  auVar113._16_4_ = auVar101._16_4_ * 0.0;
  auVar113._20_4_ = auVar101._20_4_ * 0.0;
  auVar113._24_4_ = auVar101._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar76 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar218));
  auVar107._4_4_ = auVar101._4_4_ * auVar89._4_4_;
  auVar107._0_4_ = auVar101._0_4_ * auVar89._0_4_;
  auVar107._8_4_ = auVar101._8_4_ * auVar89._8_4_;
  auVar107._12_4_ = auVar101._12_4_ * auVar89._12_4_;
  auVar107._16_4_ = auVar101._16_4_ * 0.0;
  auVar107._20_4_ = auVar101._20_4_ * 0.0;
  auVar107._24_4_ = auVar101._24_4_ * 0.0;
  auVar107._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x17 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar218));
  auVar112._0_4_ = auVar89._0_4_ * auVar101._0_4_;
  auVar112._4_4_ = auVar89._4_4_ * auVar101._4_4_;
  auVar112._8_4_ = auVar89._8_4_ * auVar101._8_4_;
  auVar112._12_4_ = auVar89._12_4_ * auVar101._12_4_;
  auVar112._16_4_ = auVar101._16_4_ * 0.0;
  auVar112._20_4_ = auVar101._20_4_ * 0.0;
  auVar112._24_4_ = auVar101._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar105,auVar114);
  auVar99 = vpminsd_avx2(auVar106,auVar113);
  auVar101 = vmaxps_avx(auVar101,auVar99);
  auVar99 = vpminsd_avx2(auVar107,auVar112);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar102._4_4_ = uVar1;
  auVar102._0_4_ = uVar1;
  auVar102._8_4_ = uVar1;
  auVar102._12_4_ = uVar1;
  auVar102._16_4_ = uVar1;
  auVar102._20_4_ = uVar1;
  auVar102._24_4_ = uVar1;
  auVar102._28_4_ = uVar1;
  auVar99 = vmaxps_avx512vl(auVar99,auVar102);
  auVar101 = vmaxps_avx(auVar101,auVar99);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  auVar99._16_4_ = 0x3f7ffffa;
  auVar99._20_4_ = 0x3f7ffffa;
  auVar99._24_4_ = 0x3f7ffffa;
  auVar99._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar101,auVar99);
  auVar101 = vpmaxsd_avx2(auVar105,auVar114);
  auVar99 = vpmaxsd_avx2(auVar106,auVar113);
  auVar101 = vminps_avx(auVar101,auVar99);
  auVar99 = vpmaxsd_avx2(auVar107,auVar112);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar103._4_4_ = uVar1;
  auVar103._0_4_ = uVar1;
  auVar103._8_4_ = uVar1;
  auVar103._12_4_ = uVar1;
  auVar103._16_4_ = uVar1;
  auVar103._20_4_ = uVar1;
  auVar103._24_4_ = uVar1;
  auVar103._28_4_ = uVar1;
  auVar99 = vminps_avx512vl(auVar99,auVar103);
  auVar101 = vminps_avx(auVar101,auVar99);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar104);
  uVar16 = vpcmpgtd_avx512vl(auVar100,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_300,auVar101,2);
  if ((byte)((byte)uVar14 & (byte)uVar16) == 0) {
    return;
  }
  local_5e8 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  pPVar78 = prim + lVar81 + 0x16;
  local_530 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5f8 = pPVar78;
  local_5f0 = prim;
LAB_01ca3ddb:
  lVar81 = 0;
  for (uVar75 = local_5e8; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  local_5e8 = local_5e8 - 1 & local_5e8;
  uVar1 = *(undefined4 *)(prim + lVar81 * 4 + 6);
  uVar75 = (ulong)(uint)((int)lVar81 << 6);
  auVar88 = *(undefined1 (*) [16])(pPVar78 + uVar75);
  if (local_5e8 != 0) {
    uVar76 = local_5e8 - 1 & local_5e8;
    for (uVar83 = local_5e8; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar95 = *(undefined1 (*) [16])(pPVar78 + uVar75 + 0x10);
  auVar89 = *(undefined1 (*) [16])(pPVar78 + uVar75 + 0x20);
  auVar94 = *(undefined1 (*) [16])(pPVar78 + uVar75 + 0x30);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar218 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar247._4_4_ = uVar167;
  auVar247._0_4_ = uVar167;
  auVar247._8_4_ = uVar167;
  auVar247._12_4_ = uVar167;
  local_420._16_4_ = uVar167;
  local_420._0_16_ = auVar247;
  local_420._20_4_ = uVar167;
  local_420._24_4_ = uVar167;
  local_420._28_4_ = uVar167;
  auVar251 = ZEXT3264(local_420);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar252._4_4_ = uVar167;
  auVar252._0_4_ = uVar167;
  auVar252._8_4_ = uVar167;
  auVar252._12_4_ = uVar167;
  local_440._16_4_ = uVar167;
  local_440._0_16_ = auVar252;
  local_440._20_4_ = uVar167;
  local_440._24_4_ = uVar167;
  local_440._28_4_ = uVar167;
  auVar86 = vunpcklps_avx(auVar247,auVar252);
  fVar236 = *(float *)(ray + k * 4 + 0x60);
  auVar253._4_4_ = fVar236;
  auVar253._0_4_ = fVar236;
  auVar253._8_4_ = fVar236;
  auVar253._12_4_ = fVar236;
  local_460._16_4_ = fVar236;
  local_460._0_16_ = auVar253;
  local_460._20_4_ = fVar236;
  local_460._24_4_ = fVar236;
  local_460._28_4_ = fVar236;
  local_710 = vinsertps_avx(auVar86,auVar253,0x28);
  auVar242 = ZEXT1664(local_710);
  auVar92._0_4_ = auVar88._0_4_ + auVar95._0_4_ + auVar89._0_4_ + auVar94._0_4_;
  auVar92._4_4_ = auVar88._4_4_ + auVar95._4_4_ + auVar89._4_4_ + auVar94._4_4_;
  auVar92._8_4_ = auVar88._8_4_ + auVar95._8_4_ + auVar89._8_4_ + auVar94._8_4_;
  auVar92._12_4_ = auVar88._12_4_ + auVar95._12_4_ + auVar89._12_4_ + auVar94._12_4_;
  auVar93._8_4_ = 0x3e800000;
  auVar93._0_8_ = 0x3e8000003e800000;
  auVar93._12_4_ = 0x3e800000;
  auVar86 = vmulps_avx512vl(auVar92,auVar93);
  auVar86 = vsubps_avx(auVar86,auVar218);
  auVar86 = vdpps_avx(auVar86,local_710,0x7f);
  fVar145 = *(float *)(ray + k * 4 + 0x30);
  local_720 = vdpps_avx(local_710,local_710,0x7f);
  auVar246 = ZEXT1664(local_720);
  uVar79 = *(uint *)(prim + 2);
  auVar231._4_12_ = ZEXT812(0) << 0x20;
  auVar231._0_4_ = local_720._0_4_;
  auVar87 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar231);
  auVar90 = vfnmadd213ss_fma(auVar87,local_720,ZEXT416(0x40000000));
  local_2e0 = auVar86._0_4_ * auVar87._0_4_ * auVar90._0_4_;
  auVar229 = ZEXT464((uint)local_2e0);
  auVar232._4_4_ = local_2e0;
  auVar232._0_4_ = local_2e0;
  auVar232._8_4_ = local_2e0;
  auVar232._12_4_ = local_2e0;
  fStack_6f0 = local_2e0;
  _local_700 = auVar232;
  fStack_6ec = local_2e0;
  fStack_6e8 = local_2e0;
  fStack_6e4 = local_2e0;
  auVar86 = vfmadd231ps_fma(auVar218,local_710,auVar232);
  auVar86 = vblendps_avx(auVar86,ZEXT816(0) << 0x40,8);
  auVar88 = vsubps_avx(auVar88,auVar86);
  auVar89 = vsubps_avx(auVar89,auVar86);
  auVar235 = ZEXT1664(auVar89);
  auVar95 = vsubps_avx(auVar95,auVar86);
  auVar238 = ZEXT1664(auVar95);
  auVar94 = vsubps_avx(auVar94,auVar86);
  local_900 = vbroadcastss_avx512vl(auVar88);
  auVar263 = ZEXT3264(local_900);
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  local_680 = ZEXT1632(auVar88);
  local_920 = vpermps_avx512vl(auVar122,local_680);
  auVar255 = ZEXT3264(local_920);
  auVar125._8_4_ = 2;
  auVar125._0_8_ = 0x200000002;
  auVar125._12_4_ = 2;
  auVar125._16_4_ = 2;
  auVar125._20_4_ = 2;
  auVar125._24_4_ = 2;
  auVar125._28_4_ = 2;
  local_940 = vpermps_avx512vl(auVar125,local_680);
  auVar256 = ZEXT3264(local_940);
  auVar126._8_4_ = 3;
  auVar126._0_8_ = 0x300000003;
  auVar126._12_4_ = 3;
  auVar126._16_4_ = 3;
  auVar126._20_4_ = 3;
  auVar126._24_4_ = 3;
  auVar126._28_4_ = 3;
  local_960 = vpermps_avx512vl(auVar126,local_680);
  auVar257 = ZEXT3264(local_960);
  local_820 = vbroadcastss_avx512vl(auVar95);
  auVar258 = ZEXT3264(local_820);
  local_6c0 = ZEXT1632(auVar95);
  local_980 = vpermps_avx512vl(auVar122,local_6c0);
  auVar259 = ZEXT3264(local_980);
  local_840 = vpermps_avx512vl(auVar125,local_6c0);
  auVar260 = ZEXT3264(local_840);
  local_9a0 = vpermps_avx512vl(auVar126,local_6c0);
  auVar261 = ZEXT3264(local_9a0);
  local_860 = vbroadcastss_avx512vl(auVar89);
  auVar262 = ZEXT3264(local_860);
  local_6a0 = ZEXT1632(auVar89);
  local_9c0 = vpermps_avx512vl(auVar122,local_6a0);
  auVar264 = ZEXT3264(local_9c0);
  local_880 = vpermps_avx512vl(auVar125,local_6a0);
  auVar265 = ZEXT3264(local_880);
  local_9e0 = vpermps_avx512vl(auVar126,local_6a0);
  auVar267 = ZEXT3264(local_9e0);
  local_260 = vbroadcastss_avx512vl(auVar94);
  _local_6e0 = ZEXT1632(auVar94);
  local_240 = vpermps_avx512vl(auVar122,_local_6e0);
  local_2a0 = vpermps_avx2(auVar125,_local_6e0);
  local_2c0 = vpermps_avx2(auVar126,_local_6e0);
  auVar88 = vfmadd231ps_fma(ZEXT432((uint)(fVar236 * fVar236)),local_440,local_440);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_420,local_420);
  local_220._0_4_ = auVar88._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar121);
  local_650 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar145 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_510 = vpbroadcastd_avx512vl();
  local_9ec = 1;
  uVar75 = 0;
  local_520 = vpbroadcastd_avx512vl();
  auVar88 = vsqrtss_avx(local_720,local_720);
  local_9e4 = auVar88._0_4_;
  auVar88 = vsqrtss_avx(local_720,local_720);
  local_9e8 = auVar88._0_4_;
  local_3b0 = ZEXT816(0x3f80000000000000);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar266 = ZEXT3264(auVar101);
  local_280 = local_240;
  do {
    auVar88 = vmovshdup_avx(local_3b0);
    auVar88 = vsubps_avx(auVar88,local_3b0);
    local_740._0_4_ = auVar88._0_4_;
    fVar227 = local_740._0_4_ * 0.04761905;
    uVar167 = local_3b0._0_4_;
    local_8e0._4_4_ = uVar167;
    local_8e0._0_4_ = uVar167;
    local_8e0._8_4_ = uVar167;
    local_8e0._12_4_ = uVar167;
    local_8e0._16_4_ = uVar167;
    local_8e0._20_4_ = uVar167;
    local_8e0._24_4_ = uVar167;
    local_8e0._28_4_ = uVar167;
    local_740._4_4_ = local_740._0_4_;
    local_740._8_4_ = local_740._0_4_;
    local_740._12_4_ = local_740._0_4_;
    local_740._16_4_ = local_740._0_4_;
    local_740._20_4_ = local_740._0_4_;
    local_740._24_4_ = local_740._0_4_;
    local_740._28_4_ = local_740._0_4_;
    auVar88 = vfmadd231ps_fma(local_8e0,local_740,_DAT_01faff20);
    auVar99 = vsubps_avx512vl(auVar266._0_32_,ZEXT1632(auVar88));
    fVar236 = auVar99._0_4_;
    fVar240 = auVar99._4_4_;
    fVar214 = auVar99._8_4_;
    fVar216 = auVar99._12_4_;
    fVar217 = auVar99._16_4_;
    fVar225 = auVar99._20_4_;
    fVar226 = auVar99._24_4_;
    fVar146 = fVar236 * fVar236 * fVar236;
    fVar161 = fVar240 * fVar240 * fVar240;
    auVar36._4_4_ = fVar161;
    auVar36._0_4_ = fVar146;
    fVar162 = fVar214 * fVar214 * fVar214;
    auVar36._8_4_ = fVar162;
    fVar163 = fVar216 * fVar216 * fVar216;
    auVar36._12_4_ = fVar163;
    fVar164 = fVar217 * fVar217 * fVar217;
    auVar36._16_4_ = fVar164;
    fVar165 = fVar225 * fVar225 * fVar225;
    auVar36._20_4_ = fVar165;
    fVar166 = fVar226 * fVar226 * fVar226;
    auVar36._24_4_ = fVar166;
    auVar36._28_4_ = local_740._0_4_;
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar102 = vmulps_avx512vl(auVar36,auVar101);
    fVar239 = auVar88._0_4_;
    fVar241 = auVar88._4_4_;
    fVar215 = auVar88._8_4_;
    fVar208 = auVar88._12_4_;
    fVar183 = fVar239 * fVar239 * fVar239;
    fVar205 = fVar241 * fVar241 * fVar241;
    fVar206 = fVar215 * fVar215 * fVar215;
    fVar207 = fVar208 * fVar208 * fVar208;
    auVar72._28_4_ = DAT_01faff20._28_4_;
    auVar72._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar183))));
    auVar243._0_4_ = fVar239 * fVar236;
    auVar243._4_4_ = fVar241 * fVar240;
    auVar243._8_4_ = fVar215 * fVar214;
    auVar243._12_4_ = fVar208 * fVar216;
    auVar243._16_4_ = fVar217 * 0.0;
    auVar243._20_4_ = fVar225 * 0.0;
    auVar243._28_36_ = auVar242._28_36_;
    auVar243._24_4_ = fVar226 * 0.0;
    auVar103 = vmulps_avx512vl(auVar72,auVar101);
    fVar245 = auVar103._28_4_ + local_740._0_4_;
    fVar228 = auVar246._28_4_;
    fVar230 = fVar245 + fVar228 + auVar229._28_4_;
    auVar37._4_4_ = fVar161 * 0.16666667;
    auVar37._0_4_ = fVar146 * 0.16666667;
    auVar37._8_4_ = fVar162 * 0.16666667;
    auVar37._12_4_ = fVar163 * 0.16666667;
    auVar37._16_4_ = fVar164 * 0.16666667;
    auVar37._20_4_ = fVar165 * 0.16666667;
    auVar37._24_4_ = fVar166 * 0.16666667;
    auVar37._28_4_ = fVar245;
    auVar38._4_4_ =
         (auVar243._4_4_ * fVar240 * 12.0 + auVar243._4_4_ * fVar241 * 6.0 +
         fVar205 + auVar102._4_4_) * 0.16666667;
    auVar38._0_4_ =
         (auVar243._0_4_ * fVar236 * 12.0 + auVar243._0_4_ * fVar239 * 6.0 +
         fVar183 + auVar102._0_4_) * 0.16666667;
    auVar38._8_4_ =
         (auVar243._8_4_ * fVar214 * 12.0 + auVar243._8_4_ * fVar215 * 6.0 +
         fVar206 + auVar102._8_4_) * 0.16666667;
    auVar38._12_4_ =
         (auVar243._12_4_ * fVar216 * 12.0 + auVar243._12_4_ * fVar208 * 6.0 +
         fVar207 + auVar102._12_4_) * 0.16666667;
    auVar38._16_4_ =
         (auVar243._16_4_ * fVar217 * 12.0 + auVar243._16_4_ * 0.0 * 6.0 + auVar102._16_4_ + 0.0) *
         0.16666667;
    auVar38._20_4_ =
         (auVar243._20_4_ * fVar225 * 12.0 + auVar243._20_4_ * 0.0 * 6.0 + auVar102._20_4_ + 0.0) *
         0.16666667;
    auVar38._24_4_ =
         (auVar243._24_4_ * fVar226 * 12.0 + auVar243._24_4_ * 0.0 * 6.0 + auVar102._24_4_ + 0.0) *
         0.16666667;
    auVar38._28_4_ = fVar228;
    auVar39._4_4_ =
         (auVar103._4_4_ + fVar161 +
         auVar243._4_4_ * fVar241 * 12.0 + auVar243._4_4_ * fVar240 * 6.0) * 0.16666667;
    auVar39._0_4_ =
         (auVar103._0_4_ + fVar146 +
         auVar243._0_4_ * fVar239 * 12.0 + auVar243._0_4_ * fVar236 * 6.0) * 0.16666667;
    auVar39._8_4_ =
         (auVar103._8_4_ + fVar162 +
         auVar243._8_4_ * fVar215 * 12.0 + auVar243._8_4_ * fVar214 * 6.0) * 0.16666667;
    auVar39._12_4_ =
         (auVar103._12_4_ + fVar163 +
         auVar243._12_4_ * fVar208 * 12.0 + auVar243._12_4_ * fVar216 * 6.0) * 0.16666667;
    auVar39._16_4_ =
         (auVar103._16_4_ + fVar164 + auVar243._16_4_ * 0.0 * 12.0 + auVar243._16_4_ * fVar217 * 6.0
         ) * 0.16666667;
    auVar39._20_4_ =
         (auVar103._20_4_ + fVar165 + auVar243._20_4_ * 0.0 * 12.0 + auVar243._20_4_ * fVar225 * 6.0
         ) * 0.16666667;
    auVar39._24_4_ =
         (auVar103._24_4_ + fVar166 + auVar243._24_4_ * 0.0 * 12.0 + auVar243._24_4_ * fVar226 * 6.0
         ) * 0.16666667;
    auVar39._28_4_ = auVar251._28_4_;
    fVar183 = fVar183 * 0.16666667;
    fVar205 = fVar205 * 0.16666667;
    fVar206 = fVar206 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    auVar40._28_4_ = fVar230;
    auVar40._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar183))));
    auVar102 = vmulps_avx512vl(local_260,auVar40);
    auVar103 = vmulps_avx512vl(local_280,auVar40);
    auVar41._4_4_ = local_2a0._4_4_ * fVar205;
    auVar41._0_4_ = local_2a0._0_4_ * fVar183;
    auVar41._8_4_ = local_2a0._8_4_ * fVar206;
    auVar41._12_4_ = local_2a0._12_4_ * fVar207;
    auVar41._16_4_ = local_2a0._16_4_ * 0.0;
    auVar41._20_4_ = local_2a0._20_4_ * 0.0;
    auVar41._24_4_ = local_2a0._24_4_ * 0.0;
    auVar41._28_4_ = local_740._0_4_;
    auVar42._4_4_ = local_2c0._4_4_ * fVar205;
    auVar42._0_4_ = local_2c0._0_4_ * fVar183;
    auVar42._8_4_ = local_2c0._8_4_ * fVar206;
    auVar42._12_4_ = local_2c0._12_4_ * fVar207;
    auVar42._16_4_ = local_2c0._16_4_ * 0.0;
    auVar42._20_4_ = local_2c0._20_4_ * 0.0;
    auVar42._24_4_ = local_2c0._24_4_ * 0.0;
    auVar42._28_4_ = fVar230;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar39,auVar262._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar39,auVar264._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar41,auVar39,auVar265._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar42,auVar267._0_32_,auVar39);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar38,auVar258._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar38,auVar259._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar38,auVar260._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar261._0_32_,auVar38);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar37,auVar263._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar37,auVar255._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar104,auVar37,auVar256._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar100,auVar257._0_32_,auVar37);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar103 = vxorps_avx512vl(auVar99,auVar100);
    auVar104 = vxorps_avx512vl(ZEXT1632(auVar88),auVar100);
    auVar223._0_4_ = auVar104._0_4_ * fVar239;
    auVar223._4_4_ = auVar104._4_4_ * fVar241;
    auVar223._8_4_ = auVar104._8_4_ * fVar215;
    auVar223._12_4_ = auVar104._12_4_ * fVar208;
    auVar223._16_4_ = auVar104._16_4_ * 0.0;
    auVar223._20_4_ = auVar104._20_4_ * 0.0;
    auVar223._24_4_ = auVar104._24_4_ * 0.0;
    auVar223._28_4_ = 0;
    auVar104 = vmulps_avx512vl(auVar243._0_32_,auVar101);
    auVar101 = vsubps_avx(auVar223,auVar104);
    auVar43._4_4_ = auVar103._4_4_ * fVar240 * 0.5;
    auVar43._0_4_ = auVar103._0_4_ * fVar236 * 0.5;
    auVar43._8_4_ = auVar103._8_4_ * fVar214 * 0.5;
    auVar43._12_4_ = auVar103._12_4_ * fVar216 * 0.5;
    auVar43._16_4_ = auVar103._16_4_ * fVar217 * 0.5;
    auVar43._20_4_ = auVar103._20_4_ * fVar225 * 0.5;
    auVar43._24_4_ = auVar103._24_4_ * fVar226 * 0.5;
    auVar43._28_4_ = auVar99._28_4_;
    auVar44._4_4_ = auVar101._4_4_ * 0.5;
    auVar44._0_4_ = auVar101._0_4_ * 0.5;
    auVar44._8_4_ = auVar101._8_4_ * 0.5;
    auVar44._12_4_ = auVar101._12_4_ * 0.5;
    auVar44._16_4_ = auVar101._16_4_ * 0.5;
    auVar44._20_4_ = auVar101._20_4_ * 0.5;
    auVar44._24_4_ = auVar101._24_4_ * 0.5;
    auVar44._28_4_ = auVar101._28_4_;
    auVar45._4_4_ = (auVar104._4_4_ + fVar240 * fVar240) * 0.5;
    auVar45._0_4_ = (auVar104._0_4_ + fVar236 * fVar236) * 0.5;
    auVar45._8_4_ = (auVar104._8_4_ + fVar214 * fVar214) * 0.5;
    auVar45._12_4_ = (auVar104._12_4_ + fVar216 * fVar216) * 0.5;
    auVar45._16_4_ = (auVar104._16_4_ + fVar217 * fVar217) * 0.5;
    auVar45._20_4_ = (auVar104._20_4_ + fVar225 * fVar225) * 0.5;
    auVar45._24_4_ = (auVar104._24_4_ + fVar226 * fVar226) * 0.5;
    auVar45._28_4_ = auVar104._28_4_ + auVar235._28_4_;
    fVar236 = fVar239 * fVar239 * 0.5;
    fVar239 = fVar241 * fVar241 * 0.5;
    fVar240 = fVar215 * fVar215 * 0.5;
    fVar241 = fVar208 * fVar208 * 0.5;
    auVar46._28_4_ = auVar238._28_4_;
    auVar46._0_28_ = ZEXT1628(CONCAT412(fVar241,CONCAT48(fVar240,CONCAT44(fVar239,fVar236))));
    auVar101 = vmulps_avx512vl(local_260,auVar46);
    auVar99 = vmulps_avx512vl(local_280,auVar46);
    auVar47._4_4_ = local_2a0._4_4_ * fVar239;
    auVar47._0_4_ = local_2a0._0_4_ * fVar236;
    auVar47._8_4_ = local_2a0._8_4_ * fVar240;
    auVar47._12_4_ = local_2a0._12_4_ * fVar241;
    auVar47._16_4_ = local_2a0._16_4_ * 0.0;
    auVar47._20_4_ = local_2a0._20_4_ * 0.0;
    auVar47._24_4_ = local_2a0._24_4_ * 0.0;
    auVar47._28_4_ = fVar228;
    auVar48._4_4_ = fVar239 * local_2c0._4_4_;
    auVar48._0_4_ = fVar236 * local_2c0._0_4_;
    auVar48._8_4_ = fVar240 * local_2c0._8_4_;
    auVar48._12_4_ = fVar241 * local_2c0._12_4_;
    auVar48._16_4_ = local_2c0._16_4_ * 0.0;
    auVar48._20_4_ = local_2c0._20_4_ * 0.0;
    auVar48._24_4_ = local_2c0._24_4_ * 0.0;
    auVar48._28_4_ = auVar238._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar45,auVar262._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar45,auVar264._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar265._0_32_);
    auVar88 = vfmadd231ps_fma(auVar48,auVar267._0_32_,auVar45);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar44,auVar258._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar44,auVar259._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar44,auVar260._0_32_);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar261._0_32_,auVar44);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar43,auVar263._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar43,auVar255._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar43,auVar256._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar257._0_32_,auVar43);
    auVar49._4_4_ = auVar101._4_4_ * fVar227;
    auVar49._0_4_ = auVar101._0_4_ * fVar227;
    auVar49._8_4_ = auVar101._8_4_ * fVar227;
    auVar49._12_4_ = auVar101._12_4_ * fVar227;
    auVar49._16_4_ = auVar101._16_4_ * fVar227;
    auVar49._20_4_ = auVar101._20_4_ * fVar227;
    auVar49._24_4_ = auVar101._24_4_ * fVar227;
    auVar49._28_4_ = auVar267._28_4_;
    auVar251 = ZEXT3264(auVar49);
    auVar50._4_4_ = auVar99._4_4_ * fVar227;
    auVar50._0_4_ = auVar99._0_4_ * fVar227;
    auVar50._8_4_ = auVar99._8_4_ * fVar227;
    auVar50._12_4_ = auVar99._12_4_ * fVar227;
    auVar50._16_4_ = auVar99._16_4_ * fVar227;
    auVar50._20_4_ = auVar99._20_4_ * fVar227;
    auVar50._24_4_ = auVar99._24_4_ * fVar227;
    auVar50._28_4_ = 0x3e2aaaab;
    auVar51._4_4_ = auVar103._4_4_ * fVar227;
    auVar51._0_4_ = auVar103._0_4_ * fVar227;
    auVar51._8_4_ = auVar103._8_4_ * fVar227;
    auVar51._12_4_ = auVar103._12_4_ * fVar227;
    auVar51._16_4_ = auVar103._16_4_ * fVar227;
    auVar51._20_4_ = auVar103._20_4_ * fVar227;
    auVar51._24_4_ = auVar103._24_4_ * fVar227;
    auVar51._28_4_ = 0x40c00000;
    fVar236 = auVar104._0_4_ * fVar227;
    fVar239 = auVar104._4_4_ * fVar227;
    auVar52._4_4_ = fVar239;
    auVar52._0_4_ = fVar236;
    fVar240 = auVar104._8_4_ * fVar227;
    auVar52._8_4_ = fVar240;
    fVar241 = auVar104._12_4_ * fVar227;
    auVar52._12_4_ = fVar241;
    fVar214 = auVar104._16_4_ * fVar227;
    auVar52._16_4_ = fVar214;
    fVar215 = auVar104._20_4_ * fVar227;
    auVar52._20_4_ = fVar215;
    fVar216 = auVar104._24_4_ * fVar227;
    auVar52._24_4_ = fVar216;
    auVar52._28_4_ = fVar227;
    auVar88 = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
    auVar108 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar88));
    auVar242 = ZEXT3264(auVar108);
    auVar98 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,ZEXT1632(auVar88));
    auVar103 = ZEXT1632(auVar88);
    auVar109 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,auVar103);
    auVar246 = ZEXT3264(auVar109);
    auVar224._0_4_ = fVar236 + auVar102._0_4_;
    auVar224._4_4_ = fVar239 + auVar102._4_4_;
    auVar224._8_4_ = fVar240 + auVar102._8_4_;
    auVar224._12_4_ = fVar241 + auVar102._12_4_;
    auVar224._16_4_ = fVar214 + auVar102._16_4_;
    auVar224._20_4_ = fVar215 + auVar102._20_4_;
    auVar224._24_4_ = fVar216 + auVar102._24_4_;
    auVar224._28_4_ = fVar227 + auVar102._28_4_;
    auVar101 = vmaxps_avx(auVar102,auVar224);
    auVar99 = vminps_avx(auVar102,auVar224);
    auVar110 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar103);
    auVar96 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar103);
    auVar238 = ZEXT3264(auVar96);
    auVar97 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar103);
    auVar125 = ZEXT1632(auVar88);
    auVar111 = vpermt2ps_avx512vl(auVar51,_DAT_01feed00,auVar125);
    auVar102 = vpermt2ps_avx512vl(auVar52,_DAT_01feed00,auVar125);
    auVar112 = vsubps_avx512vl(auVar110,auVar102);
    auVar102 = vsubps_avx(auVar108,auVar105);
    auVar235 = ZEXT3264(auVar102);
    auVar103 = vsubps_avx(auVar98,auVar106);
    auVar104 = vsubps_avx(auVar109,auVar107);
    auVar229 = ZEXT3264(auVar104);
    auVar113 = vmulps_avx512vl(auVar103,auVar51);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar50,auVar104);
    auVar114 = vmulps_avx512vl(auVar104,auVar49);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar51,auVar102);
    auVar115 = vmulps_avx512vl(auVar102,auVar50);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar49,auVar103);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar114 = vmulps_avx512vl(auVar104,auVar104);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar103,auVar103);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar102,auVar102);
    auVar115 = vrcp14ps_avx512vl(auVar114);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar116);
    auVar115 = vfmadd132ps_avx512vl(auVar117,auVar115,auVar115);
    auVar113 = vmulps_avx512vl(auVar113,auVar115);
    auVar117 = vmulps_avx512vl(auVar103,auVar111);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar97,auVar104);
    auVar118 = vmulps_avx512vl(auVar104,auVar96);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar111,auVar102);
    auVar119 = vmulps_avx512vl(auVar102,auVar97);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar96,auVar103);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar115 = vmulps_avx512vl(auVar117,auVar115);
    auVar113 = vmaxps_avx512vl(auVar113,auVar115);
    auVar113 = vsqrtps_avx512vl(auVar113);
    auVar115 = vmaxps_avx512vl(auVar112,auVar110);
    auVar101 = vmaxps_avx512vl(auVar101,auVar115);
    auVar115 = vaddps_avx512vl(auVar113,auVar101);
    auVar101 = vminps_avx512vl(auVar112,auVar110);
    auVar101 = vminps_avx(auVar99,auVar101);
    auVar101 = vsubps_avx512vl(auVar101,auVar113);
    auVar213._8_4_ = 0x3f800002;
    auVar213._0_8_ = 0x3f8000023f800002;
    auVar213._12_4_ = 0x3f800002;
    auVar213._16_4_ = 0x3f800002;
    auVar213._20_4_ = 0x3f800002;
    auVar213._24_4_ = 0x3f800002;
    auVar213._28_4_ = 0x3f800002;
    auVar99 = vmulps_avx512vl(auVar115,auVar213);
    auVar25._8_4_ = 0x3f7ffffc;
    auVar25._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar25._12_4_ = 0x3f7ffffc;
    auVar25._16_4_ = 0x3f7ffffc;
    auVar25._20_4_ = 0x3f7ffffc;
    auVar25._24_4_ = 0x3f7ffffc;
    auVar25._28_4_ = 0x3f7ffffc;
    auVar101 = vmulps_avx512vl(auVar101,auVar25);
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar110 = vrsqrt14ps_avx512vl(auVar114);
    auVar26._8_4_ = 0xbf000000;
    auVar26._0_8_ = 0xbf000000bf000000;
    auVar26._12_4_ = 0xbf000000;
    auVar26._16_4_ = 0xbf000000;
    auVar26._20_4_ = 0xbf000000;
    auVar26._24_4_ = 0xbf000000;
    auVar26._28_4_ = 0xbf000000;
    auVar112 = vmulps_avx512vl(auVar114,auVar26);
    fVar236 = auVar110._0_4_;
    fVar239 = auVar110._4_4_;
    fVar240 = auVar110._8_4_;
    fVar241 = auVar110._12_4_;
    fVar214 = auVar110._16_4_;
    fVar215 = auVar110._20_4_;
    fVar216 = auVar110._24_4_;
    auVar53._4_4_ = fVar239 * fVar239 * fVar239 * auVar112._4_4_;
    auVar53._0_4_ = fVar236 * fVar236 * fVar236 * auVar112._0_4_;
    auVar53._8_4_ = fVar240 * fVar240 * fVar240 * auVar112._8_4_;
    auVar53._12_4_ = fVar241 * fVar241 * fVar241 * auVar112._12_4_;
    auVar53._16_4_ = fVar214 * fVar214 * fVar214 * auVar112._16_4_;
    auVar53._20_4_ = fVar215 * fVar215 * fVar215 * auVar112._20_4_;
    auVar53._24_4_ = fVar216 * fVar216 * fVar216 * auVar112._24_4_;
    auVar53._28_4_ = auVar115._28_4_;
    auVar27._8_4_ = 0x3fc00000;
    auVar27._0_8_ = 0x3fc000003fc00000;
    auVar27._12_4_ = 0x3fc00000;
    auVar27._16_4_ = 0x3fc00000;
    auVar27._20_4_ = 0x3fc00000;
    auVar27._24_4_ = 0x3fc00000;
    auVar27._28_4_ = 0x3fc00000;
    auVar110 = vfmadd231ps_avx512vl(auVar53,auVar110,auVar27);
    auVar112 = vmulps_avx512vl(auVar102,auVar110);
    auVar113 = vmulps_avx512vl(auVar103,auVar110);
    auVar114 = vmulps_avx512vl(auVar104,auVar110);
    auVar115 = vsubps_avx512vl(auVar125,auVar105);
    auVar117 = vsubps_avx512vl(auVar125,auVar106);
    auVar118 = vsubps_avx512vl(auVar125,auVar107);
    auVar119 = vmulps_avx512vl(local_460,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_440,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_420,auVar115);
    auVar120 = vmulps_avx512vl(auVar118,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar117);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,auVar115);
    auVar121 = vmulps_avx512vl(local_460,auVar114);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar113,local_440);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar112,local_420);
    auVar114 = vmulps_avx512vl(auVar118,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar117,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar112);
    auVar113 = vmulps_avx512vl(auVar121,auVar121);
    auVar114 = vsubps_avx512vl(local_220,auVar113);
    auVar122 = vmulps_avx512vl(auVar121,auVar112);
    auVar119 = vsubps_avx512vl(auVar119,auVar122);
    auVar119 = vaddps_avx512vl(auVar119,auVar119);
    auVar122 = vmulps_avx512vl(auVar112,auVar112);
    local_760 = vsubps_avx512vl(auVar120,auVar122);
    auVar99 = vsubps_avx512vl(local_760,auVar99);
    local_7c0 = vmulps_avx512vl(auVar119,auVar119);
    auVar28._8_4_ = 0x40800000;
    auVar28._0_8_ = 0x4080000040800000;
    auVar28._12_4_ = 0x40800000;
    auVar28._16_4_ = 0x40800000;
    auVar28._20_4_ = 0x40800000;
    auVar28._24_4_ = 0x40800000;
    auVar28._28_4_ = 0x40800000;
    _local_7e0 = vmulps_avx512vl(auVar114,auVar28);
    auVar120 = vmulps_avx512vl(_local_7e0,auVar99);
    auVar120 = vsubps_avx512vl(local_7c0,auVar120);
    uVar83 = vcmpps_avx512vl(auVar120,auVar125,5);
    bVar73 = (byte)uVar83;
    fVar236 = (float)local_700._0_4_;
    fVar239 = (float)local_700._4_4_;
    fVar240 = fStack_6f8;
    fVar241 = fStack_6f4;
    fVar214 = fStack_6f0;
    fVar215 = fStack_6ec;
    fVar216 = fStack_6e8;
    fVar208 = fStack_6e4;
    if (bVar73 == 0) {
      auVar266 = ZEXT3264(auVar116);
LAB_01ca4a9a:
      auVar263 = ZEXT3264(local_900);
      auVar255 = ZEXT3264(local_920);
      auVar256 = ZEXT3264(local_940);
      auVar257 = ZEXT3264(local_960);
      auVar258 = ZEXT3264(local_820);
      auVar259 = ZEXT3264(local_980);
      auVar260 = ZEXT3264(local_840);
      auVar261 = ZEXT3264(local_9a0);
      auVar262 = ZEXT3264(local_860);
      auVar264 = ZEXT3264(local_9c0);
      auVar265 = ZEXT3264(local_880);
      auVar267 = ZEXT3264(local_9e0);
    }
    else {
      auVar120 = vsqrtps_avx512vl(auVar120);
      auVar122 = vaddps_avx512vl(auVar114,auVar114);
      local_560 = vrcp14ps_avx512vl(auVar122);
      auVar116 = vfnmadd213ps_avx512vl(local_560,auVar122,auVar116);
      auVar116 = vfmadd132ps_avx512vl(auVar116,local_560,local_560);
      local_800 = vxorps_avx512vl(auVar119,auVar100);
      auVar100 = vsubps_avx512vl(local_800,auVar120);
      auVar100 = vmulps_avx512vl(auVar100,auVar116);
      auVar120 = vsubps_avx512vl(auVar120,auVar119);
      _local_580 = vmulps_avx512vl(auVar120,auVar116);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vblendmps_avx512vl(auVar116,auVar100);
      auVar123._0_4_ =
           (uint)(bVar73 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar116._0_4_;
      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * auVar116._4_4_;
      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * auVar116._8_4_;
      bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * auVar116._12_4_;
      bVar6 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * auVar116._16_4_;
      bVar6 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * auVar116._20_4_;
      bVar6 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar6 * auVar120._24_4_ | (uint)!bVar6 * auVar116._24_4_;
      bVar6 = SUB81(uVar83 >> 7,0);
      auVar123._28_4_ = (uint)bVar6 * auVar120._28_4_ | (uint)!bVar6 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar116,_local_580);
      auVar124._0_4_ =
           (uint)(bVar73 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar116._0_4_;
      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * auVar116._4_4_;
      bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * auVar116._8_4_;
      bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * auVar116._12_4_;
      bVar6 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * auVar116._16_4_;
      bVar6 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * auVar116._20_4_;
      bVar6 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar6 * auVar120._24_4_ | (uint)!bVar6 * auVar116._24_4_;
      bVar6 = SUB81(uVar83 >> 7,0);
      auVar124._28_4_ = (uint)bVar6 * auVar120._28_4_ | (uint)!bVar6 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar113,auVar116);
      local_5a0 = vmaxps_avx512vl(local_240,auVar116);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      local_5c0 = vmulps_avx512vl(local_5a0,auVar29);
      vandps_avx512vl(auVar114,auVar116);
      uVar76 = vcmpps_avx512vl(local_5c0,local_5c0,1);
      uVar83 = uVar83 & uVar76;
      bVar77 = (byte)uVar83;
      if (bVar77 != 0) {
        uVar76 = vcmpps_avx512vl(auVar99,_DAT_01faff00,2);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar114 = vblendmps_avx512vl(auVar99,auVar113);
        bVar80 = (byte)uVar76;
        uVar85 = (uint)(bVar80 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar80 & 1) * local_5c0._0_4_;
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        uVar84 = (uint)bVar6 * auVar114._4_4_ | (uint)!bVar6 * local_5c0._4_4_;
        bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
        uVar138 = (uint)bVar6 * auVar114._8_4_ | (uint)!bVar6 * local_5c0._8_4_;
        bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
        uVar139 = (uint)bVar6 * auVar114._12_4_ | (uint)!bVar6 * local_5c0._12_4_;
        bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
        uVar140 = (uint)bVar6 * auVar114._16_4_ | (uint)!bVar6 * local_5c0._16_4_;
        bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
        uVar141 = (uint)bVar6 * auVar114._20_4_ | (uint)!bVar6 * local_5c0._20_4_;
        bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
        uVar142 = (uint)bVar6 * auVar114._24_4_ | (uint)!bVar6 * local_5c0._24_4_;
        bVar6 = SUB81(uVar76 >> 7,0);
        uVar143 = (uint)bVar6 * auVar114._28_4_ | (uint)!bVar6 * local_5c0._28_4_;
        auVar123._0_4_ = (bVar77 & 1) * uVar85 | !(bool)(bVar77 & 1) * auVar123._0_4_;
        bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = bVar6 * uVar84 | !bVar6 * auVar123._4_4_;
        bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = bVar6 * uVar138 | !bVar6 * auVar123._8_4_;
        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = bVar6 * uVar139 | !bVar6 * auVar123._12_4_;
        bVar6 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = bVar6 * uVar140 | !bVar6 * auVar123._16_4_;
        bVar6 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = bVar6 * uVar141 | !bVar6 * auVar123._20_4_;
        bVar6 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = bVar6 * uVar142 | !bVar6 * auVar123._24_4_;
        bVar6 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = bVar6 * uVar143 | !bVar6 * auVar123._28_4_;
        auVar99 = vblendmps_avx512vl(auVar113,auVar99);
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar76 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar76 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar76 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
        bVar13 = SUB81(uVar76 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar80 & 1) * auVar99._0_4_ | !(bool)(bVar80 & 1) * uVar85) |
             !(bool)(bVar77 & 1) * auVar124._0_4_;
        bVar7 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar7 * ((uint)bVar6 * auVar99._4_4_ | !bVar6 * uVar84) | !bVar7 * auVar124._4_4_
        ;
        bVar6 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar99._8_4_ | !bVar8 * uVar138) |
             !bVar6 * auVar124._8_4_;
        bVar6 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar99._12_4_ | !bVar9 * uVar139) |
             !bVar6 * auVar124._12_4_;
        bVar6 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar99._16_4_ | !bVar10 * uVar140) |
             !bVar6 * auVar124._16_4_;
        bVar6 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar99._20_4_ | !bVar11 * uVar141) |
             !bVar6 * auVar124._20_4_;
        bVar6 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar99._24_4_ | !bVar12 * uVar142) |
             !bVar6 * auVar124._24_4_;
        bVar6 = SUB81(uVar83 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar6 * ((uint)bVar13 * auVar99._28_4_ | !bVar13 * uVar143) |
             !bVar6 * auVar124._28_4_;
        bVar73 = (~bVar77 | bVar80) & bVar73;
      }
      if ((bVar73 & 0x7f) == 0) {
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar266 = ZEXT3264(auVar101);
        goto LAB_01ca4a9a;
      }
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar111 = vxorps_avx512vl(auVar111,auVar99);
      auVar96 = vxorps_avx512vl(auVar96,auVar99);
      uVar85 = *(uint *)(ray + k * 4 + 0x80);
      auVar97 = vxorps_avx512vl(auVar97,auVar99);
      local_770 = ZEXT416(uVar85);
      auVar88 = vsubss_avx512f(local_770,ZEXT416((uint)local_650._0_4_));
      auVar113 = vbroadcastss_avx512vl(auVar88);
      auVar113 = vminps_avx512vl(auVar113,auVar124);
      auVar71._4_4_ = fStack_2dc;
      auVar71._0_4_ = local_2e0;
      auVar71._8_4_ = fStack_2d8;
      auVar71._12_4_ = fStack_2d4;
      auVar71._16_4_ = fStack_2d0;
      auVar71._20_4_ = fStack_2cc;
      auVar71._24_4_ = fStack_2c8;
      auVar71._28_4_ = fStack_2c4;
      auVar114 = vmaxps_avx512vl(auVar71,auVar123);
      auVar116 = vmulps_avx512vl(auVar51,auVar118);
      auVar116 = vfmadd213ps_avx512vl(auVar117,auVar50,auVar116);
      auVar88 = vfmadd213ps_fma(auVar115,auVar49,auVar116);
      auVar115 = vmulps_avx512vl(local_460,auVar51);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_440,auVar50);
      auVar95 = vfmadd231ps_fma(auVar115,local_420,auVar49);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar95),auVar115);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar115,auVar116,1);
      auVar117 = vxorps_avx512vl(ZEXT1632(auVar88),auVar99);
      auVar118 = vrcp14ps_avx512vl(ZEXT1632(auVar95));
      auVar213 = ZEXT1632(auVar95);
      auVar120 = vxorps_avx512vl(auVar213,auVar99);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar126 = vfnmadd213ps_avx512vl(auVar118,auVar213,auVar125);
      auVar88 = vfmadd132ps_fma(auVar126,auVar118,auVar118);
      fVar217 = auVar88._0_4_ * auVar117._0_4_;
      fVar225 = auVar88._4_4_ * auVar117._4_4_;
      auVar54._4_4_ = fVar225;
      auVar54._0_4_ = fVar217;
      fVar226 = auVar88._8_4_ * auVar117._8_4_;
      auVar54._8_4_ = fVar226;
      fVar227 = auVar88._12_4_ * auVar117._12_4_;
      auVar54._12_4_ = fVar227;
      fVar228 = auVar117._16_4_ * 0.0;
      auVar54._16_4_ = fVar228;
      fVar146 = auVar117._20_4_ * 0.0;
      auVar54._20_4_ = fVar146;
      fVar161 = auVar117._24_4_ * 0.0;
      auVar54._24_4_ = fVar161;
      auVar54._28_4_ = auVar117._28_4_;
      uVar16 = vcmpps_avx512vl(auVar213,auVar120,1);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar250._8_4_ = 0xff800000;
      auVar250._0_8_ = 0xff800000ff800000;
      auVar250._12_4_ = 0xff800000;
      auVar250._16_4_ = 0xff800000;
      auVar250._20_4_ = 0xff800000;
      auVar250._24_4_ = 0xff800000;
      auVar250._28_4_ = 0xff800000;
      auVar118 = vblendmps_avx512vl(auVar54,auVar250);
      auVar127._0_4_ = (uint)(bVar77 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar77 & 1) * -0x800000;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * -0x800000;
      auVar127._28_4_ =
           (uint)(bVar77 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar77 >> 7) * -0x800000;
      auVar118 = vmaxps_avx512vl(auVar114,auVar127);
      auVar251 = ZEXT3264(auVar118);
      uVar16 = vcmpps_avx512vl(auVar213,auVar120,6);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar128._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * (int)fVar217;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar225;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar226;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar227;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar228;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar146;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar161;
      auVar128._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar117._28_4_;
      auVar113 = vminps_avx512vl(auVar113,auVar128);
      auVar88 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar88),auVar108);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar88),auVar98);
      auVar114 = ZEXT1632(auVar88);
      auVar109 = vsubps_avx512vl(auVar114,auVar109);
      auVar109 = vmulps_avx512vl(auVar109,auVar111);
      auVar98 = vfmadd231ps_avx512vl(auVar109,auVar97,auVar98);
      auVar108 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar108);
      auVar98 = vmulps_avx512vl(local_460,auVar111);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_440,auVar97);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_420,auVar96);
      vandps_avx512vl(auVar98,auVar115);
      uVar14 = vcmpps_avx512vl(auVar98,auVar116,1);
      auVar108 = vxorps_avx512vl(auVar108,auVar99);
      auVar109 = vrcp14ps_avx512vl(auVar98);
      auVar99 = vxorps_avx512vl(auVar98,auVar99);
      auVar246 = ZEXT3264(auVar99);
      auVar96 = vfnmadd213ps_avx512vl(auVar109,auVar98,auVar125);
      auVar88 = vfmadd132ps_fma(auVar96,auVar109,auVar109);
      fVar217 = auVar88._0_4_ * auVar108._0_4_;
      fVar225 = auVar88._4_4_ * auVar108._4_4_;
      auVar55._4_4_ = fVar225;
      auVar55._0_4_ = fVar217;
      fVar226 = auVar88._8_4_ * auVar108._8_4_;
      auVar55._8_4_ = fVar226;
      fVar227 = auVar88._12_4_ * auVar108._12_4_;
      auVar55._12_4_ = fVar227;
      fVar228 = auVar108._16_4_ * 0.0;
      auVar55._16_4_ = fVar228;
      fVar146 = auVar108._20_4_ * 0.0;
      auVar55._20_4_ = fVar146;
      fVar161 = auVar108._24_4_ * 0.0;
      auVar55._24_4_ = fVar161;
      auVar55._28_4_ = auVar108._28_4_;
      uVar16 = vcmpps_avx512vl(auVar98,auVar99,1);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar30._8_4_ = 0xff800000;
      auVar30._0_8_ = 0xff800000ff800000;
      auVar30._12_4_ = 0xff800000;
      auVar30._16_4_ = 0xff800000;
      auVar30._20_4_ = 0xff800000;
      auVar30._24_4_ = 0xff800000;
      auVar30._28_4_ = 0xff800000;
      auVar96 = vblendmps_avx512vl(auVar55,auVar30);
      auVar129._0_4_ =
           (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar109._0_4_;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * auVar109._4_4_;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * auVar109._8_4_;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * auVar109._12_4_;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * auVar109._16_4_;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * auVar109._20_4_;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * auVar109._24_4_;
      auVar129._28_4_ =
           (uint)(bVar77 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar109._28_4_;
      _local_5e0 = vmaxps_avx(auVar118,auVar129);
      auVar238 = ZEXT3264(_local_5e0);
      uVar16 = vcmpps_avx512vl(auVar98,auVar99,6);
      bVar77 = (byte)uVar14 | (byte)uVar16;
      auVar130._0_4_ = (uint)(bVar77 & 1) * 0x7f800000 | (uint)!(bool)(bVar77 & 1) * (int)fVar217;
      bVar6 = (bool)(bVar77 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar225;
      bVar6 = (bool)(bVar77 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar226;
      bVar6 = (bool)(bVar77 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar227;
      bVar6 = (bool)(bVar77 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar228;
      bVar6 = (bool)(bVar77 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar146;
      bVar6 = (bool)(bVar77 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar161;
      auVar130._28_4_ =
           (uint)(bVar77 >> 7) * 0x7f800000 | (uint)!(bool)(bVar77 >> 7) * auVar108._28_4_;
      local_360 = vminps_avx(auVar113,auVar130);
      auVar242 = ZEXT3264(local_360);
      uVar14 = vcmpps_avx512vl(_local_5e0,local_360,2);
      bVar73 = bVar73 & 0x7f & (byte)uVar14;
      if (bVar73 == 0) {
        auVar266 = ZEXT3264(auVar125);
        goto LAB_01ca4a9a;
      }
      auVar99 = vmaxps_avx512vl(auVar114,auVar101);
      auVar101 = vfmadd213ps_avx512vl(auVar100,auVar121,auVar112);
      auVar101 = vmulps_avx512vl(auVar110,auVar101);
      auVar100 = vfmadd213ps_avx512vl(_local_580,auVar121,auVar112);
      auVar56._4_4_ = auVar110._4_4_ * auVar100._4_4_;
      auVar56._0_4_ = auVar110._0_4_ * auVar100._0_4_;
      auVar56._8_4_ = auVar110._8_4_ * auVar100._8_4_;
      auVar56._12_4_ = auVar110._12_4_ * auVar100._12_4_;
      auVar56._16_4_ = auVar110._16_4_ * auVar100._16_4_;
      auVar56._20_4_ = auVar110._20_4_ * auVar100._20_4_;
      auVar56._24_4_ = auVar110._24_4_ * auVar100._24_4_;
      auVar56._28_4_ = auVar129._28_4_;
      auVar101 = vminps_avx512vl(auVar101,auVar125);
      auVar63 = ZEXT812(0);
      auVar100 = ZEXT1232(auVar63) << 0x20;
      auVar101 = vmaxps_avx(auVar101,ZEXT1232(auVar63) << 0x20);
      auVar108 = vminps_avx512vl(auVar56,auVar125);
      auVar57._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar57._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar57._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar57._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar57._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar57._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar57._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar57._28_4_ = auVar101._28_4_ + 7.0;
      auVar88 = vfmadd213ps_fma(auVar57,local_740,local_8e0);
      local_1a0 = ZEXT1632(auVar88);
      auVar101 = vmaxps_avx(auVar108,ZEXT1232(auVar63) << 0x20);
      auVar58._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar58._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar58._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar58._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar58._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar58._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar58._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar58._28_4_ = auVar101._28_4_ + 7.0;
      auVar88 = vfmadd213ps_fma(auVar58,local_740,local_8e0);
      local_1c0 = ZEXT1632(auVar88);
      auVar59._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar59._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar59._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar59._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar59._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar59._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar59._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar59._28_4_ = auVar99._28_4_;
      auVar101 = vsubps_avx(local_760,auVar59);
      auVar60._4_4_ = auVar101._4_4_ * (float)local_7e0._4_4_;
      auVar60._0_4_ = auVar101._0_4_ * (float)local_7e0._0_4_;
      auVar60._8_4_ = auVar101._8_4_ * fStack_7d8;
      auVar60._12_4_ = auVar101._12_4_ * fStack_7d4;
      auVar60._16_4_ = auVar101._16_4_ * fStack_7d0;
      auVar60._20_4_ = auVar101._20_4_ * fStack_7cc;
      auVar60._24_4_ = auVar101._24_4_ * fStack_7c8;
      auVar60._28_4_ = auVar99._28_4_;
      auVar99 = vsubps_avx(local_7c0,auVar60);
      uVar83 = vcmpps_avx512vl(auVar99,ZEXT1232(auVar63) << 0x20,5);
      auVar262 = ZEXT3264(local_860);
      auVar265 = ZEXT3264(local_880);
      if ((byte)uVar83 == 0) {
        uVar83 = 0;
        auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar229 = ZEXT864(0) << 0x20;
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar244 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar131._8_4_ = 0x7f800000;
        auVar131._0_8_ = 0x7f8000007f800000;
        auVar131._12_4_ = 0x7f800000;
        auVar131._16_4_ = 0x7f800000;
        auVar131._20_4_ = 0x7f800000;
        auVar131._24_4_ = 0x7f800000;
        auVar131._28_4_ = 0x7f800000;
        auVar132._8_4_ = 0xff800000;
        auVar132._0_8_ = 0xff800000ff800000;
        auVar132._12_4_ = 0xff800000;
        auVar132._16_4_ = 0xff800000;
        auVar132._20_4_ = 0xff800000;
        auVar132._24_4_ = 0xff800000;
        auVar132._28_4_ = 0xff800000;
      }
      else {
        uVar76 = vcmpps_avx512vl(auVar99,auVar114,5);
        auVar99 = vsqrtps_avx(auVar99);
        auVar100 = vfnmadd213ps_avx512vl(auVar122,local_560,auVar125);
        auVar98 = vfmadd132ps_avx512vl(auVar100,local_560,local_560);
        auVar100 = vsubps_avx(local_800,auVar99);
        auVar109 = vmulps_avx512vl(auVar100,auVar98);
        auVar99 = vsubps_avx512vl(auVar99,auVar119);
        auVar98 = vmulps_avx512vl(auVar99,auVar98);
        auVar99 = vfmadd213ps_avx512vl(auVar121,auVar109,auVar112);
        auVar61._4_4_ = auVar110._4_4_ * auVar99._4_4_;
        auVar61._0_4_ = auVar110._0_4_ * auVar99._0_4_;
        auVar61._8_4_ = auVar110._8_4_ * auVar99._8_4_;
        auVar61._12_4_ = auVar110._12_4_ * auVar99._12_4_;
        auVar61._16_4_ = auVar110._16_4_ * auVar99._16_4_;
        auVar61._20_4_ = auVar110._20_4_ * auVar99._20_4_;
        auVar61._24_4_ = auVar110._24_4_ * auVar99._24_4_;
        auVar61._28_4_ = auVar108._28_4_;
        auVar99 = vmulps_avx512vl(local_420,auVar109);
        auVar100 = vmulps_avx512vl(local_440,auVar109);
        auVar96 = vmulps_avx512vl(local_460,auVar109);
        auVar108 = vfmadd213ps_avx512vl(auVar102,auVar61,auVar105);
        auVar99 = vsubps_avx512vl(auVar99,auVar108);
        auVar108 = vfmadd213ps_avx512vl(auVar103,auVar61,auVar106);
        auVar108 = vsubps_avx512vl(auVar100,auVar108);
        auVar88 = vfmadd213ps_fma(auVar61,auVar104,auVar107);
        auVar100 = vsubps_avx(auVar96,ZEXT1632(auVar88));
        auVar244 = auVar100._0_28_;
        auVar100 = vfmadd213ps_avx512vl(auVar121,auVar98,auVar112);
        auVar110 = vmulps_avx512vl(auVar110,auVar100);
        auVar100 = vmulps_avx512vl(local_420,auVar98);
        auVar96 = vmulps_avx512vl(local_440,auVar98);
        auVar97 = vmulps_avx512vl(local_460,auVar98);
        auVar88 = vfmadd213ps_fma(auVar102,auVar110,auVar105);
        auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar103,auVar110,auVar106);
        auVar102 = vsubps_avx512vl(auVar96,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar104,auVar110,auVar107);
        auVar103 = vsubps_avx512vl(auVar97,ZEXT1632(auVar88));
        auVar229 = ZEXT3264(auVar103);
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar153._16_4_ = 0x7f800000;
        auVar153._20_4_ = 0x7f800000;
        auVar153._24_4_ = 0x7f800000;
        auVar153._28_4_ = 0x7f800000;
        auVar103 = vblendmps_avx512vl(auVar153,auVar109);
        bVar6 = (bool)((byte)uVar76 & 1);
        auVar131._0_4_ = (uint)bVar6 * auVar103._0_4_ | (uint)!bVar6 * auVar105._0_4_;
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar6 * auVar103._4_4_ | (uint)!bVar6 * auVar105._4_4_;
        bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar6 * auVar103._8_4_ | (uint)!bVar6 * auVar105._8_4_;
        bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar6 * auVar103._12_4_ | (uint)!bVar6 * auVar105._12_4_;
        bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar6 * auVar103._16_4_ | (uint)!bVar6 * auVar105._16_4_;
        bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar6 * auVar103._20_4_ | (uint)!bVar6 * auVar105._20_4_;
        bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar6 * auVar103._24_4_ | (uint)!bVar6 * auVar105._24_4_;
        bVar6 = SUB81(uVar76 >> 7,0);
        auVar131._28_4_ = (uint)bVar6 * auVar103._28_4_ | (uint)!bVar6 * auVar105._28_4_;
        auVar154._8_4_ = 0xff800000;
        auVar154._0_8_ = 0xff800000ff800000;
        auVar154._12_4_ = 0xff800000;
        auVar154._16_4_ = 0xff800000;
        auVar154._20_4_ = 0xff800000;
        auVar154._24_4_ = 0xff800000;
        auVar154._28_4_ = 0xff800000;
        auVar103 = vblendmps_avx512vl(auVar154,auVar98);
        bVar6 = (bool)((byte)uVar76 & 1);
        auVar132._0_4_ = (uint)bVar6 * auVar103._0_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar6 * auVar103._4_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar6 * auVar103._8_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar6 * auVar103._12_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar6 * auVar103._16_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar6 * auVar103._20_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar6 * auVar103._24_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = SUB81(uVar76 >> 7,0);
        auVar132._28_4_ = (uint)bVar6 * auVar103._28_4_ | (uint)!bVar6 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar103 = vmulps_avx512vl(local_5a0,auVar31);
        uVar15 = vcmpps_avx512vl(auVar103,local_5c0,0xe);
        uVar76 = uVar76 & uVar15;
        bVar77 = (byte)uVar76;
        if (bVar77 != 0) {
          uVar15 = vcmpps_avx512vl(auVar101,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar101 = vblendmps_avx512vl(auVar234,auVar237);
          bVar80 = (byte)uVar15;
          uVar84 = (uint)(bVar80 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar103._0_4_;
          bVar6 = (bool)((byte)(uVar15 >> 1) & 1);
          uVar138 = (uint)bVar6 * auVar101._4_4_ | (uint)!bVar6 * auVar103._4_4_;
          bVar6 = (bool)((byte)(uVar15 >> 2) & 1);
          uVar139 = (uint)bVar6 * auVar101._8_4_ | (uint)!bVar6 * auVar103._8_4_;
          bVar6 = (bool)((byte)(uVar15 >> 3) & 1);
          uVar140 = (uint)bVar6 * auVar101._12_4_ | (uint)!bVar6 * auVar103._12_4_;
          bVar6 = (bool)((byte)(uVar15 >> 4) & 1);
          uVar141 = (uint)bVar6 * auVar101._16_4_ | (uint)!bVar6 * auVar103._16_4_;
          bVar6 = (bool)((byte)(uVar15 >> 5) & 1);
          uVar142 = (uint)bVar6 * auVar101._20_4_ | (uint)!bVar6 * auVar103._20_4_;
          bVar6 = (bool)((byte)(uVar15 >> 6) & 1);
          uVar143 = (uint)bVar6 * auVar101._24_4_ | (uint)!bVar6 * auVar103._24_4_;
          bVar6 = SUB81(uVar15 >> 7,0);
          uVar144 = (uint)bVar6 * auVar101._28_4_ | (uint)!bVar6 * auVar103._28_4_;
          auVar131._0_4_ = (bVar77 & 1) * uVar84 | !(bool)(bVar77 & 1) * auVar131._0_4_;
          bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar131._4_4_ = bVar6 * uVar138 | !bVar6 * auVar131._4_4_;
          bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar131._8_4_ = bVar6 * uVar139 | !bVar6 * auVar131._8_4_;
          bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar131._12_4_ = bVar6 * uVar140 | !bVar6 * auVar131._12_4_;
          bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar131._16_4_ = bVar6 * uVar141 | !bVar6 * auVar131._16_4_;
          bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar131._20_4_ = bVar6 * uVar142 | !bVar6 * auVar131._20_4_;
          bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar131._24_4_ = bVar6 * uVar143 | !bVar6 * auVar131._24_4_;
          bVar6 = SUB81(uVar76 >> 7,0);
          auVar131._28_4_ = bVar6 * uVar144 | !bVar6 * auVar131._28_4_;
          auVar101 = vblendmps_avx512vl(auVar237,auVar234);
          bVar6 = (bool)((byte)(uVar15 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar15 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar15 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar15 >> 6) & 1);
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar132._0_4_ =
               (uint)(bVar77 & 1) *
               ((uint)(bVar80 & 1) * auVar101._0_4_ | !(bool)(bVar80 & 1) * uVar84) |
               !(bool)(bVar77 & 1) * auVar132._0_4_;
          bVar7 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar132._4_4_ =
               (uint)bVar7 * ((uint)bVar6 * auVar101._4_4_ | !bVar6 * uVar138) |
               !bVar7 * auVar132._4_4_;
          bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar132._8_4_ =
               (uint)bVar6 * ((uint)bVar8 * auVar101._8_4_ | !bVar8 * uVar139) |
               !bVar6 * auVar132._8_4_;
          bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar132._12_4_ =
               (uint)bVar6 * ((uint)bVar9 * auVar101._12_4_ | !bVar9 * uVar140) |
               !bVar6 * auVar132._12_4_;
          bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar132._16_4_ =
               (uint)bVar6 * ((uint)bVar10 * auVar101._16_4_ | !bVar10 * uVar141) |
               !bVar6 * auVar132._16_4_;
          bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar132._20_4_ =
               (uint)bVar6 * ((uint)bVar11 * auVar101._20_4_ | !bVar11 * uVar142) |
               !bVar6 * auVar132._20_4_;
          bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar132._24_4_ =
               (uint)bVar6 * ((uint)bVar12 * auVar101._24_4_ | !bVar12 * uVar143) |
               !bVar6 * auVar132._24_4_;
          bVar6 = SUB81(uVar76 >> 7,0);
          auVar132._28_4_ =
               (uint)bVar6 * ((uint)bVar13 * auVar101._28_4_ | !bVar13 * uVar144) |
               !bVar6 * auVar132._28_4_;
          uVar83 = (ulong)(byte)((~bVar77 | bVar80) & (byte)uVar83);
        }
      }
      auVar263 = ZEXT3264(local_900);
      auVar255 = ZEXT3264(local_920);
      auVar256 = ZEXT3264(local_940);
      auVar257 = ZEXT3264(local_960);
      auVar259 = ZEXT3264(local_980);
      auVar261 = ZEXT3264(local_9a0);
      auVar264 = ZEXT3264(local_9c0);
      auVar267 = ZEXT3264(local_9e0);
      auVar251 = ZEXT3264(local_460);
      auVar235._0_4_ = local_460._0_4_ * auVar229._0_4_;
      auVar235._4_4_ = local_460._4_4_ * auVar229._4_4_;
      auVar235._8_4_ = local_460._8_4_ * auVar229._8_4_;
      auVar235._12_4_ = local_460._12_4_ * auVar229._12_4_;
      auVar235._16_4_ = local_460._16_4_ * auVar229._16_4_;
      auVar235._20_4_ = local_460._20_4_ * auVar229._20_4_;
      auVar235._28_36_ = auVar229._28_36_;
      auVar235._24_4_ = local_460._24_4_ * auVar229._24_4_;
      auVar238 = ZEXT3264(local_440);
      auVar88 = vfmadd231ps_fma(auVar235._0_32_,local_440,auVar102);
      auVar235 = ZEXT3264(local_420);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_420,auVar100);
      auVar246 = ZEXT3264(_local_5e0);
      _local_200 = _local_5e0;
      local_1e0 = vminps_avx(local_360,auVar131);
      auVar233._8_4_ = 0x7fffffff;
      auVar233._0_8_ = 0x7fffffff7fffffff;
      auVar233._12_4_ = 0x7fffffff;
      auVar233._16_4_ = 0x7fffffff;
      auVar233._20_4_ = 0x7fffffff;
      auVar233._24_4_ = 0x7fffffff;
      auVar233._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(ZEXT1632(auVar88),auVar233);
      local_380 = vmaxps_avx(_local_5e0,auVar132);
      auVar229 = ZEXT3264(local_380);
      auVar156._8_4_ = 0x3e99999a;
      auVar156._0_8_ = 0x3e99999a3e99999a;
      auVar156._12_4_ = 0x3e99999a;
      auVar156._16_4_ = 0x3e99999a;
      auVar156._20_4_ = 0x3e99999a;
      auVar156._24_4_ = 0x3e99999a;
      auVar156._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar101,auVar156,1);
      local_400._0_2_ = (short)uVar14;
      uVar14 = vcmpps_avx512vl(_local_5e0,local_1e0,2);
      bVar77 = (byte)uVar14 & bVar73;
      uVar16 = vcmpps_avx512vl(local_380,local_360,2);
      auVar258 = ZEXT3264(local_820);
      auVar260 = ZEXT3264(local_840);
      if ((bVar73 & ((byte)uVar16 | (byte)uVar14)) == 0) {
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar266 = ZEXT3264(auVar101);
      }
      else {
        uVar76 = CONCAT71((int7)(uVar83 >> 8),~(byte)uVar83);
        auVar62._4_4_ = local_460._4_4_ * auVar244._4_4_;
        auVar62._0_4_ = local_460._0_4_ * auVar244._0_4_;
        auVar62._8_4_ = local_460._8_4_ * auVar244._8_4_;
        auVar62._12_4_ = local_460._12_4_ * auVar244._12_4_;
        auVar62._16_4_ = local_460._16_4_ * auVar244._16_4_;
        auVar62._20_4_ = local_460._20_4_ * auVar244._20_4_;
        auVar62._24_4_ = local_460._24_4_ * auVar244._24_4_;
        auVar62._28_4_ = 0x3e99999a;
        auVar88 = vfmadd213ps_fma(auVar108,local_440,auVar62);
        auVar88 = vfmadd213ps_fma(auVar99,local_420,ZEXT1632(auVar88));
        auVar101 = vandps_avx(ZEXT1632(auVar88),auVar233);
        uVar14 = vcmpps_avx512vl(auVar101,auVar156,1);
        bVar80 = (byte)uVar14 | ~(byte)uVar83;
        auVar157._8_4_ = 2;
        auVar157._0_8_ = 0x200000002;
        auVar157._12_4_ = 2;
        auVar157._16_4_ = 2;
        auVar157._20_4_ = 2;
        auVar157._24_4_ = 2;
        auVar157._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar101 = vpblendmd_avx512vl(auVar157,auVar32);
        local_320._0_4_ = (uint)(bVar80 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar6 = (bool)(bVar80 >> 1 & 1);
        local_320._4_4_ = (uint)bVar6 * auVar101._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 2 & 1);
        local_320._8_4_ = (uint)bVar6 * auVar101._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 3 & 1);
        local_320._12_4_ = (uint)bVar6 * auVar101._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 4 & 1);
        local_320._16_4_ = (uint)bVar6 * auVar101._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 5 & 1);
        local_320._20_4_ = (uint)bVar6 * auVar101._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 6 & 1);
        local_320._24_4_ = (uint)bVar6 * auVar101._24_4_ | (uint)!bVar6 * 2;
        local_320._28_4_ = (uint)(bVar80 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        local_3a0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_3a0,local_320,5);
        bVar80 = (byte)uVar14 & bVar77;
        if (bVar80 == 0) {
          auVar159._4_4_ = uVar85;
          auVar159._0_4_ = uVar85;
          auVar159._8_4_ = uVar85;
          auVar159._12_4_ = uVar85;
          auVar159._16_4_ = uVar85;
          auVar159._20_4_ = uVar85;
          auVar159._24_4_ = uVar85;
          auVar159._28_4_ = uVar85;
        }
        else {
          local_340 = local_380;
          local_9f0 = (uint)uVar76;
          auVar95 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar89 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar94 = vminps_avx(auVar95,auVar89);
          auVar95 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar89 = vmaxps_avx(auVar88,auVar95);
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar94,auVar184);
          auVar95 = vandps_avx(auVar89,auVar184);
          auVar88 = vmaxps_avx(auVar88,auVar95);
          auVar95 = vmovshdup_avx(auVar88);
          auVar95 = vmaxss_avx(auVar95,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar95);
          local_790._0_4_ = auVar88._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar89,auVar89,0xff);
          local_3e0 = (float)local_5e0._0_4_ + (float)local_700._0_4_;
          fStack_3dc = (float)local_5e0._4_4_ + (float)local_700._4_4_;
          fStack_3d8 = fStack_5d8 + fStack_6f8;
          fStack_3d4 = fStack_5d4 + fStack_6f4;
          fStack_3d0 = fStack_5d0 + fStack_6f0;
          fStack_3cc = fStack_5cc + fStack_6ec;
          fStack_3c8 = fStack_5c8 + fStack_6e8;
          fStack_3c4 = fStack_5c4 + fStack_6e4;
          do {
            auVar158._8_4_ = 0x7f800000;
            auVar158._0_8_ = 0x7f8000007f800000;
            auVar158._12_4_ = 0x7f800000;
            auVar158._16_4_ = 0x7f800000;
            auVar158._20_4_ = 0x7f800000;
            auVar158._24_4_ = 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar101 = vblendmps_avx512vl(auVar158,_local_5e0);
            auVar134._0_4_ =
                 (uint)(bVar80 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar6 * auVar101._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar6 * auVar101._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar6 * auVar101._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar6 * auVar101._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar6 * auVar101._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar80 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar101 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar101 = vminps_avx(auVar134,auVar101);
            auVar99 = vshufpd_avx(auVar101,auVar101,5);
            auVar101 = vminps_avx(auVar101,auVar99);
            auVar99 = vpermpd_avx2(auVar101,0x4e);
            auVar101 = vminps_avx(auVar101,auVar99);
            uVar14 = vcmpps_avx512vl(auVar134,auVar101,0);
            bVar74 = (byte)uVar14 & bVar80;
            bVar82 = bVar80;
            if (bVar74 != 0) {
              bVar82 = bVar74;
            }
            iVar18 = 0;
            for (uVar85 = (uint)bVar82; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            auVar229 = ZEXT464(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
            auVar238 = ZEXT464(*(uint *)(local_200 + (uint)(iVar18 << 2)));
            fVar236 = local_9e8;
            if ((float)local_720._0_4_ < 0.0) {
              local_8e0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar18 << 2)));
              fVar236 = sqrtf((float)local_720._0_4_);
              auVar238 = ZEXT1664(local_7c0._0_16_);
              auVar229 = ZEXT1664(local_8e0._0_16_);
            }
            lVar81 = 5;
            do {
              local_7c0._0_16_ = auVar238._0_16_;
              uVar167 = auVar238._0_4_;
              auVar147._4_4_ = uVar167;
              auVar147._0_4_ = uVar167;
              auVar147._8_4_ = uVar167;
              auVar147._12_4_ = uVar167;
              auVar88 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_710);
              fVar214 = auVar229._0_4_;
              fVar208 = 1.0 - fVar214;
              fVar241 = fVar208 * fVar208 * fVar208;
              fVar239 = fVar214 * fVar214;
              fVar216 = fVar214 * fVar239;
              auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar241),
                                        ZEXT416((uint)fVar216));
              fVar240 = fVar214 * fVar208;
              auVar218 = ZEXT416((uint)fVar208);
              auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar240 * 6.0)),
                                        ZEXT416((uint)(fVar240 * fVar208)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                        ZEXT416((uint)fVar241));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar208 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar214 * fVar240)));
              fVar241 = fVar241 * 0.16666667;
              fVar214 = (auVar95._0_4_ + auVar94._0_4_) * 0.16666667;
              fVar215 = (auVar89._0_4_ + auVar86._0_4_) * 0.16666667;
              fVar216 = fVar216 * 0.16666667;
              auVar185._0_4_ = fVar216 * (float)local_6e0._0_4_;
              auVar185._4_4_ = fVar216 * (float)local_6e0._4_4_;
              auVar185._8_4_ = fVar216 * fStack_6d8;
              auVar185._12_4_ = fVar216 * fStack_6d4;
              auVar219._4_4_ = fVar215;
              auVar219._0_4_ = fVar215;
              auVar219._8_4_ = fVar215;
              auVar219._12_4_ = fVar215;
              auVar95 = vfmadd132ps_fma(auVar219,auVar185,local_6a0._0_16_);
              auVar186._4_4_ = fVar214;
              auVar186._0_4_ = fVar214;
              auVar186._8_4_ = fVar214;
              auVar186._12_4_ = fVar214;
              auVar95 = vfmadd132ps_fma(auVar186,auVar95,local_6c0._0_16_);
              auVar169._4_4_ = fVar241;
              auVar169._0_4_ = fVar241;
              auVar169._8_4_ = fVar241;
              auVar169._12_4_ = fVar241;
              auVar95 = vfmadd132ps_fma(auVar169,auVar95,local_680._0_16_);
              local_560._0_16_ = auVar95;
              auVar88 = vsubps_avx(auVar88,auVar95);
              local_740._0_16_ = auVar88;
              auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
              local_8e0._0_16_ = auVar229._0_16_;
              local_760._0_16_ = auVar88;
              if (auVar88._0_4_ < 0.0) {
                local_7e0._0_4_ = fVar239;
                local_800._0_4_ = fVar240;
                auVar229._0_4_ = sqrtf(auVar88._0_4_);
                auVar229._4_60_ = extraout_var;
                auVar88 = auVar229._0_16_;
                fVar240 = (float)local_800._0_4_;
                auVar95 = local_8e0._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                local_7e0._0_4_ = fVar239;
                auVar95 = auVar229._0_16_;
              }
              local_580._4_4_ = fVar208;
              local_580._0_4_ = fVar208;
              fStack_578 = fVar208;
              fStack_574 = fVar208;
              auVar89 = vfnmsub213ss_fma(auVar95,auVar95,ZEXT416((uint)(fVar240 * 4.0)));
              auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * 4.0)),auVar218,auVar218);
              fVar239 = fVar208 * -fVar208 * 0.5;
              fVar240 = auVar89._0_4_ * 0.5;
              fVar241 = auVar95._0_4_ * 0.5;
              local_7e0._0_4_ = (float)local_7e0._0_4_ * 0.5;
              auVar209._0_4_ = (float)local_7e0._0_4_ * (float)local_6e0._0_4_;
              auVar209._4_4_ = (float)local_7e0._0_4_ * (float)local_6e0._4_4_;
              auVar209._8_4_ = (float)local_7e0._0_4_ * fStack_6d8;
              auVar209._12_4_ = (float)local_7e0._0_4_ * fStack_6d4;
              auVar170._4_4_ = fVar241;
              auVar170._0_4_ = fVar241;
              auVar170._8_4_ = fVar241;
              auVar170._12_4_ = fVar241;
              auVar95 = vfmadd132ps_fma(auVar170,auVar209,local_6a0._0_16_);
              auVar187._4_4_ = fVar240;
              auVar187._0_4_ = fVar240;
              auVar187._8_4_ = fVar240;
              auVar187._12_4_ = fVar240;
              auVar95 = vfmadd132ps_fma(auVar187,auVar95,local_6c0._0_16_);
              auVar248._4_4_ = fVar239;
              auVar248._0_4_ = fVar239;
              auVar248._8_4_ = fVar239;
              auVar248._12_4_ = fVar239;
              _local_7e0 = vfmadd132ps_fma(auVar248,auVar95,local_680._0_16_);
              local_5a0._0_16_ = vdpps_avx(_local_7e0,_local_7e0,0x7f);
              auVar64._12_4_ = 0;
              auVar64._0_12_ = ZEXT812(0);
              fVar239 = local_5a0._0_4_;
              local_780 = vrsqrt14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar239));
              fVar240 = local_780._0_4_;
              local_5c0._0_16_ = vrcp14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar239));
              auVar95 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_770._0_4_ = auVar95._0_4_;
              local_800._0_4_ = auVar88._0_4_;
              if (fVar239 < -fVar239) {
                auVar238._0_4_ = sqrtf(fVar239);
                auVar238._4_60_ = extraout_var_00;
                auVar88 = ZEXT416((uint)local_800._0_4_);
                auVar89 = auVar238._0_16_;
                auVar95 = _local_7e0;
              }
              else {
                auVar89 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
                auVar95 = _local_7e0;
              }
              fVar241 = local_780._0_4_;
              fVar239 = fVar240 * 1.5 + fVar239 * -0.5 * fVar241 * fVar241 * fVar241;
              local_780._0_4_ = auVar95._0_4_ * fVar239;
              local_780._4_4_ = auVar95._4_4_ * fVar239;
              local_780._8_4_ = auVar95._8_4_ * fVar239;
              local_780._12_4_ = auVar95._12_4_ * fVar239;
              auVar94 = vdpps_avx(local_740._0_16_,local_780,0x7f);
              fVar214 = auVar88._0_4_;
              fVar240 = auVar94._0_4_;
              auVar148._0_4_ = fVar240 * fVar240;
              auVar148._4_4_ = auVar94._4_4_ * auVar94._4_4_;
              auVar148._8_4_ = auVar94._8_4_ * auVar94._8_4_;
              auVar148._12_4_ = auVar94._12_4_ * auVar94._12_4_;
              auVar86 = vsubps_avx(local_760._0_16_,auVar148);
              fVar241 = auVar86._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar241;
              auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar87 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
              auVar91 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
              if (fVar241 < 0.0) {
                local_610._0_4_ = auVar87._0_4_;
                local_630 = fVar239;
                fStack_62c = fVar239;
                fStack_628 = fVar239;
                fStack_624 = fVar239;
                local_620 = auVar90;
                fVar241 = sqrtf(fVar241);
                auVar91 = ZEXT416(auVar91._0_4_);
                auVar87 = ZEXT416((uint)local_610._0_4_);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar88 = ZEXT416((uint)local_800._0_4_);
                auVar95 = _local_7e0;
                auVar90 = local_620;
                fVar239 = local_630;
                fVar215 = fStack_62c;
                fVar216 = fStack_628;
                fVar208 = fStack_624;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar241 = auVar86._0_4_;
                fVar215 = fVar239;
                fVar216 = fVar239;
                fVar208 = fVar239;
              }
              auVar251 = ZEXT1664(auVar95);
              auVar246 = ZEXT1664(local_760._0_16_);
              auVar242 = ZEXT1664(local_740._0_16_);
              auVar263 = ZEXT3264(local_900);
              auVar255 = ZEXT3264(local_920);
              auVar256 = ZEXT3264(local_940);
              auVar257 = ZEXT3264(local_960);
              auVar258 = ZEXT3264(local_820);
              auVar259 = ZEXT3264(local_980);
              auVar260 = ZEXT3264(local_840);
              auVar261 = ZEXT3264(local_9a0);
              auVar262 = ZEXT3264(local_860);
              auVar264 = ZEXT3264(local_9c0);
              auVar265 = ZEXT3264(local_880);
              auVar267 = ZEXT3264(local_9e0);
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar218,local_8e0._0_16_);
              auVar86 = vfmadd231ss_fma(auVar218,local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
              fVar225 = local_8e0._0_4_;
              auVar188._0_4_ = fVar225 * (float)local_6e0._0_4_;
              auVar188._4_4_ = fVar225 * (float)local_6e0._4_4_;
              auVar188._8_4_ = fVar225 * fStack_6d8;
              auVar188._12_4_ = fVar225 * fStack_6d4;
              auVar210._0_4_ = auVar86._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar86 = vfmadd132ps_fma(auVar210,auVar188,local_6a0._0_16_);
              auVar172._0_4_ = auVar93._0_4_;
              auVar172._4_4_ = auVar172._0_4_;
              auVar172._8_4_ = auVar172._0_4_;
              auVar172._12_4_ = auVar172._0_4_;
              auVar86 = vfmadd132ps_fma(auVar172,auVar86,local_6c0._0_16_);
              auVar86 = vfmadd132ps_fma(_local_580,auVar86,local_680._0_16_);
              auVar173._0_4_ = auVar86._0_4_ * (float)local_5a0._0_4_;
              auVar173._4_4_ = auVar86._4_4_ * (float)local_5a0._0_4_;
              auVar173._8_4_ = auVar86._8_4_ * (float)local_5a0._0_4_;
              auVar173._12_4_ = auVar86._12_4_ * (float)local_5a0._0_4_;
              auVar86 = vdpps_avx(auVar95,auVar86,0x7f);
              fVar217 = auVar86._0_4_;
              auVar189._0_4_ = auVar95._0_4_ * fVar217;
              auVar189._4_4_ = auVar95._4_4_ * fVar217;
              auVar189._8_4_ = auVar95._8_4_ * fVar217;
              auVar189._12_4_ = auVar95._12_4_ * fVar217;
              auVar86 = vsubps_avx(auVar173,auVar189);
              fVar217 = (float)local_770._0_4_ * (float)local_5c0._0_4_;
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(auVar95,auVar19);
              auVar220._0_4_ = fVar239 * auVar86._0_4_ * fVar217;
              auVar220._4_4_ = fVar215 * auVar86._4_4_ * fVar217;
              auVar220._8_4_ = fVar216 * auVar86._8_4_ * fVar217;
              auVar220._12_4_ = fVar208 * auVar86._12_4_ * fVar217;
              auVar86 = vdpps_avx(auVar92,local_780,0x7f);
              auVar218 = vmaxss_avx(ZEXT416((uint)local_790._0_4_),
                                    ZEXT416((uint)((float)local_7c0._0_4_ * fVar236 * 1.9073486e-06)
                                           ));
              auVar93 = vdivss_avx512f(ZEXT416((uint)local_790._0_4_),auVar89);
              auVar89 = vdpps_avx(local_740._0_16_,auVar220,0x7f);
              auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)local_790._0_4_),auVar218);
              auVar93 = vfmadd213ss_fma(ZEXT416((uint)(fVar214 + 1.0)),auVar93,auVar88);
              auVar88 = vdpps_avx(local_710,local_780,0x7f);
              fVar239 = auVar86._0_4_ + auVar89._0_4_;
              auVar89 = vdpps_avx(local_740._0_16_,auVar92,0x7f);
              auVar91 = vmulss_avx512f(auVar91,auVar90);
              auVar90 = vmulss_avx512f(auVar90,auVar90);
              auVar86 = vdpps_avx(local_740._0_16_,local_710,0x7f);
              auVar91 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar91._0_4_ * auVar90._0_4_)));
              auVar90 = vfnmadd231ss_fma(auVar89,auVar94,ZEXT416((uint)fVar239));
              auVar87 = vfnmadd231ss_fma(auVar86,auVar94,auVar88);
              auVar89 = vpermilps_avx(local_560._0_16_,0xff);
              fVar241 = fVar241 - auVar89._0_4_;
              auVar89 = vshufps_avx(auVar95,auVar95,0xff);
              auVar86 = vfmsub213ss_fma(auVar90,auVar91,auVar89);
              fVar214 = auVar87._0_4_ * auVar91._0_4_;
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar86._0_4_)),
                                        ZEXT416((uint)fVar239),ZEXT416((uint)fVar214));
              auVar235 = ZEXT1664(auVar90);
              fVar215 = auVar90._0_4_;
              fVar225 = fVar225 - (fVar240 * (fVar214 / fVar215) -
                                  fVar241 * (auVar88._0_4_ / fVar215));
              auVar229 = ZEXT464((uint)fVar225);
              fVar239 = (float)local_7c0._0_4_ -
                        (fVar241 * (fVar239 / fVar215) - fVar240 * (auVar86._0_4_ / fVar215));
              auVar238 = ZEXT464((uint)fVar239);
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar94,auVar20);
              if (auVar88._0_4_ < auVar93._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar93._0_4_ + auVar218._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar94 = vandps_avx512vl(ZEXT416((uint)fVar241),auVar21);
                if (auVar94._0_4_ < auVar88._0_4_) {
                  fVar236 = fVar239 + (float)local_650._0_4_;
                  if ((((fVar236 < fVar145) ||
                       (fVar240 = *(float *)(ray + k * 4 + 0x80), fVar240 < fVar236)) ||
                      (fVar225 < 0.0)) || (1.0 < fVar225)) break;
                  auVar190._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar190._0_4_ = local_760._0_4_;
                  auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar190);
                  fVar241 = auVar88._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar241 = fVar241 * 1.5 + local_760._0_4_ * -0.5 * fVar241 * fVar241 * fVar241;
                  auVar191._0_4_ = local_740._0_4_ * fVar241;
                  auVar191._4_4_ = local_740._4_4_ * fVar241;
                  auVar191._8_4_ = local_740._8_4_ * fVar241;
                  auVar191._12_4_ = local_740._12_4_ * fVar241;
                  auVar86 = vfmadd213ps_fma(auVar89,auVar191,auVar95);
                  auVar88 = vshufps_avx(auVar191,auVar191,0xc9);
                  auVar89 = vshufps_avx(auVar95,auVar95,0xc9);
                  auVar192._0_4_ = auVar191._0_4_ * auVar89._0_4_;
                  auVar192._4_4_ = auVar191._4_4_ * auVar89._4_4_;
                  auVar192._8_4_ = auVar191._8_4_ * auVar89._8_4_;
                  auVar192._12_4_ = auVar191._12_4_ * auVar89._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar192,auVar95,auVar88);
                  auVar88 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar89 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar94 = vshufps_avx(auVar94,auVar94,0xd2);
                  auVar149._0_4_ = auVar86._0_4_ * auVar94._0_4_;
                  auVar149._4_4_ = auVar86._4_4_ * auVar94._4_4_;
                  auVar149._8_4_ = auVar86._8_4_ * auVar94._8_4_;
                  auVar149._12_4_ = auVar86._12_4_ * auVar94._12_4_;
                  auVar88 = vfmsub231ps_fma(auVar149,auVar88,auVar89);
                  uVar167 = auVar88._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar236;
                    uVar3 = vextractps_avx(auVar88,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                    uVar3 = vextractps_avx(auVar88,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar167;
                    *(float *)(ray + k * 4 + 0xf0) = fVar225;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                    *(uint *)(ray + k * 4 + 0x120) = uVar79;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_500 = (RTCHitN  [16])vshufps_avx(auVar88,auVar88,0x55);
                  auStack_4f0 = vshufps_avx(auVar88,auVar88,0xaa);
                  local_4e0 = uVar167;
                  uStack_4dc = uVar167;
                  uStack_4d8 = uVar167;
                  uStack_4d4 = uVar167;
                  local_4d0 = fVar225;
                  fStack_4cc = fVar225;
                  fStack_4c8 = fVar225;
                  fStack_4c4 = fVar225;
                  local_4c0 = ZEXT416(0) << 0x20;
                  local_4b0 = local_520._0_8_;
                  uStack_4a8 = local_520._8_8_;
                  local_4a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_48c = context->user->instID[0];
                  local_490 = uStack_48c;
                  uStack_488 = uStack_48c;
                  uStack_484 = uStack_48c;
                  uStack_480 = context->user->instPrimID[0];
                  uStack_47c = uStack_480;
                  uStack_478 = uStack_480;
                  uStack_474 = uStack_480;
                  *(float *)(ray + k * 4 + 0x80) = fVar236;
                  local_a00 = local_530;
                  local_8b0.valid = (int *)local_a00;
                  local_8b0.geometryUserPtr = pGVar4->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_500;
                  local_8b0.N = 4;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar235 = ZEXT1664(auVar90);
                    auVar238 = ZEXT464((uint)fVar239);
                    auVar242 = ZEXT1664(local_740._0_16_);
                    auVar246 = ZEXT1664(local_760._0_16_);
                    auVar251 = ZEXT1664(auVar95);
                    (*pGVar4->intersectionFilterN)(&local_8b0);
                    auVar267 = ZEXT3264(local_9e0);
                    auVar265 = ZEXT3264(local_880);
                    auVar264 = ZEXT3264(local_9c0);
                    auVar262 = ZEXT3264(local_860);
                    auVar261 = ZEXT3264(local_9a0);
                    auVar260 = ZEXT3264(local_840);
                    auVar259 = ZEXT3264(local_980);
                    auVar258 = ZEXT3264(local_820);
                    auVar257 = ZEXT3264(local_960);
                    auVar256 = ZEXT3264(local_940);
                    auVar255 = ZEXT3264(local_920);
                    auVar263 = ZEXT3264(local_900);
                  }
                  uVar83 = vptestmd_avx512vl(local_a00,local_a00);
                  if ((uVar83 & 0xf) != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      auVar251 = ZEXT1664(auVar251._0_16_);
                      (*p_Var5)(&local_8b0);
                      auVar267 = ZEXT3264(local_9e0);
                      auVar265 = ZEXT3264(local_880);
                      auVar264 = ZEXT3264(local_9c0);
                      auVar262 = ZEXT3264(local_860);
                      auVar261 = ZEXT3264(local_9a0);
                      auVar260 = ZEXT3264(local_840);
                      auVar259 = ZEXT3264(local_980);
                      auVar258 = ZEXT3264(local_820);
                      auVar257 = ZEXT3264(local_960);
                      auVar256 = ZEXT3264(local_940);
                      auVar255 = ZEXT3264(local_920);
                      auVar263 = ZEXT3264(local_900);
                    }
                    uVar83 = vptestmd_avx512vl(local_a00,local_a00);
                    uVar83 = uVar83 & 0xf;
                    bVar82 = (byte)uVar83;
                    if (bVar82 != 0) {
                      iVar66 = *(int *)(local_8b0.hit + 4);
                      iVar67 = *(int *)(local_8b0.hit + 8);
                      iVar68 = *(int *)(local_8b0.hit + 0xc);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xc0) =
                           (uint)(bVar82 & 1) * *(int *)local_8b0.hit |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xc0);
                      *(uint *)(local_8b0.ray + 0xc4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xc4);
                      *(uint *)(local_8b0.ray + 200) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 200);
                      *(uint *)(local_8b0.ray + 0xcc) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xcc);
                      iVar66 = *(int *)(local_8b0.hit + 0x14);
                      iVar67 = *(int *)(local_8b0.hit + 0x18);
                      iVar68 = *(int *)(local_8b0.hit + 0x1c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xd0) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x10) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xd0);
                      *(uint *)(local_8b0.ray + 0xd4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xd4);
                      *(uint *)(local_8b0.ray + 0xd8) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0xd8);
                      *(uint *)(local_8b0.ray + 0xdc) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xdc);
                      iVar66 = *(int *)(local_8b0.hit + 0x24);
                      iVar67 = *(int *)(local_8b0.hit + 0x28);
                      iVar68 = *(int *)(local_8b0.hit + 0x2c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xe0) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x20) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xe0);
                      *(uint *)(local_8b0.ray + 0xe4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xe4);
                      *(uint *)(local_8b0.ray + 0xe8) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0xe8);
                      *(uint *)(local_8b0.ray + 0xec) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xec);
                      iVar66 = *(int *)(local_8b0.hit + 0x34);
                      iVar67 = *(int *)(local_8b0.hit + 0x38);
                      iVar68 = *(int *)(local_8b0.hit + 0x3c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xf0) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x30) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xf0);
                      *(uint *)(local_8b0.ray + 0xf4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xf4);
                      *(uint *)(local_8b0.ray + 0xf8) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0xf8);
                      *(uint *)(local_8b0.ray + 0xfc) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xfc);
                      iVar66 = *(int *)(local_8b0.hit + 0x44);
                      iVar67 = *(int *)(local_8b0.hit + 0x48);
                      iVar68 = *(int *)(local_8b0.hit + 0x4c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0x100) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x40) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0x100);
                      *(uint *)(local_8b0.ray + 0x104) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0x104);
                      *(uint *)(local_8b0.ray + 0x108) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x108);
                      *(uint *)(local_8b0.ray + 0x10c) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x10c);
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x50));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x110) = auVar88;
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x60));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x120) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x70));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x130) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x80));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x140) = auVar88;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar240;
                  break;
                }
              }
              lVar81 = lVar81 + -1;
            } while (lVar81 != 0);
            uVar167 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar159._4_4_ = uVar167;
            auVar159._0_4_ = uVar167;
            auVar159._8_4_ = uVar167;
            auVar159._12_4_ = uVar167;
            auVar159._16_4_ = uVar167;
            auVar159._20_4_ = uVar167;
            auVar159._24_4_ = uVar167;
            auVar159._28_4_ = uVar167;
            auVar69._4_4_ = fStack_3dc;
            auVar69._0_4_ = local_3e0;
            auVar69._8_4_ = fStack_3d8;
            auVar69._12_4_ = fStack_3d4;
            auVar69._16_4_ = fStack_3d0;
            auVar69._20_4_ = fStack_3cc;
            auVar69._24_4_ = fStack_3c8;
            auVar69._28_4_ = fStack_3c4;
            uVar14 = vcmpps_avx512vl(auVar159,auVar69,0xd);
            bVar80 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar80 & (byte)uVar14;
          } while (bVar80 != 0);
          uVar76 = (ulong)local_9f0;
          auVar229 = ZEXT3264(local_340);
        }
        bVar80 = local_400[0] | (byte)uVar76;
        auVar181._0_4_ = (float)local_700._0_4_ + auVar229._0_4_;
        auVar181._4_4_ = (float)local_700._4_4_ + auVar229._4_4_;
        auVar181._8_4_ = fStack_6f8 + auVar229._8_4_;
        auVar181._12_4_ = fStack_6f4 + auVar229._12_4_;
        auVar181._16_4_ = fStack_6f0 + auVar229._16_4_;
        auVar181._20_4_ = fStack_6ec + auVar229._20_4_;
        auVar181._24_4_ = fStack_6e8 + auVar229._24_4_;
        auVar181._28_4_ = fStack_6e4 + auVar229._28_4_;
        uVar14 = vcmpps_avx512vl(auVar181,auVar159,2);
        bVar73 = (byte)uVar16 & bVar73 & (byte)uVar14;
        auVar182._8_4_ = 2;
        auVar182._0_8_ = 0x200000002;
        auVar182._12_4_ = 2;
        auVar182._16_4_ = 2;
        auVar182._20_4_ = 2;
        auVar182._24_4_ = 2;
        auVar182._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar101 = vpblendmd_avx512vl(auVar182,auVar33);
        auVar135._0_4_ = (uint)(bVar80 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar6 = (bool)(bVar80 >> 1 & 1);
        auVar135._4_4_ = (uint)bVar6 * auVar101._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 2 & 1);
        auVar135._8_4_ = (uint)bVar6 * auVar101._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 3 & 1);
        auVar135._12_4_ = (uint)bVar6 * auVar101._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 4 & 1);
        auVar135._16_4_ = (uint)bVar6 * auVar101._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 5 & 1);
        auVar135._20_4_ = (uint)bVar6 * auVar101._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar80 >> 6 & 1);
        auVar135._24_4_ = (uint)bVar6 * auVar101._24_4_ | (uint)!bVar6 * 2;
        auVar135._28_4_ = (uint)(bVar80 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        uVar14 = vpcmpd_avx512vl(local_3a0,auVar135,5);
        bVar80 = (byte)uVar14 & bVar73;
        fVar236 = (float)local_700._0_4_;
        fVar239 = (float)local_700._4_4_;
        fVar240 = fStack_6f8;
        fVar241 = fStack_6f4;
        fVar214 = fStack_6f0;
        fVar215 = fStack_6ec;
        fVar216 = fStack_6e8;
        fVar208 = fStack_6e4;
        if (bVar80 != 0) {
          local_400 = auVar135;
          auVar95 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar89 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar94 = vminps_avx(auVar95,auVar89);
          auVar95 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar89 = vmaxps_avx(auVar88,auVar95);
          auVar193._8_4_ = 0x7fffffff;
          auVar193._0_8_ = 0x7fffffff7fffffff;
          auVar193._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar94,auVar193);
          auVar95 = vandps_avx(auVar89,auVar193);
          auVar88 = vmaxps_avx(auVar88,auVar95);
          auVar95 = vmovshdup_avx(auVar88);
          auVar95 = vmaxss_avx(auVar95,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar95);
          fVar236 = auVar88._0_4_ * 1.9073486e-06;
          local_640 = vshufps_avx(auVar89,auVar89,0xff);
          local_3e0 = (float)local_700._0_4_ + local_380._0_4_;
          fStack_3dc = (float)local_700._4_4_ + local_380._4_4_;
          fStack_3d8 = fStack_6f8 + local_380._8_4_;
          fStack_3d4 = fStack_6f4 + local_380._12_4_;
          fStack_3d0 = fStack_6f0 + local_380._16_4_;
          fStack_3cc = fStack_6ec + local_380._20_4_;
          fStack_3c8 = fStack_6e8 + local_380._24_4_;
          fStack_3c4 = fStack_6e4 + local_380._28_4_;
          _local_5e0 = local_380;
          do {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar101 = vblendmps_avx512vl(auVar160,_local_5e0);
            auVar136._0_4_ =
                 (uint)(bVar80 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar6 * auVar101._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar6 * auVar101._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar6 * auVar101._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar6 * auVar101._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar80 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar6 * auVar101._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar136._24_4_ =
                 (uint)(bVar80 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar101 = vshufps_avx(auVar136,auVar136,0xb1);
            auVar101 = vminps_avx(auVar136,auVar101);
            auVar99 = vshufpd_avx(auVar101,auVar101,5);
            auVar101 = vminps_avx(auVar101,auVar99);
            auVar99 = vpermpd_avx2(auVar101,0x4e);
            auVar101 = vminps_avx(auVar101,auVar99);
            uVar14 = vcmpps_avx512vl(auVar136,auVar101,0);
            bVar74 = (byte)uVar14 & bVar80;
            bVar82 = bVar80;
            if (bVar74 != 0) {
              bVar82 = bVar74;
            }
            iVar18 = 0;
            for (uVar85 = (uint)bVar82; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            auVar266 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
            auVar238 = ZEXT464(*(uint *)(local_360 + (uint)(iVar18 << 2)));
            fVar239 = local_9e4;
            if ((float)local_720._0_4_ < 0.0) {
              local_8e0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_360 + (uint)(iVar18 << 2)));
              fVar239 = sqrtf((float)local_720._0_4_);
              auVar238 = ZEXT1664(local_7c0._0_16_);
              auVar266 = ZEXT1664(local_8e0._0_16_);
            }
            local_780._0_4_ = fVar239 * 1.9073486e-06;
            lVar81 = 5;
            do {
              local_7c0._0_16_ = auVar238._0_16_;
              uVar167 = auVar238._0_4_;
              auVar150._4_4_ = uVar167;
              auVar150._0_4_ = uVar167;
              auVar150._8_4_ = uVar167;
              auVar150._12_4_ = uVar167;
              auVar88 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_710);
              fVar214 = auVar266._0_4_;
              fVar208 = 1.0 - fVar214;
              fVar241 = fVar208 * fVar208 * fVar208;
              fVar239 = fVar214 * fVar214;
              fVar216 = fVar214 * fVar239;
              auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar241),
                                        ZEXT416((uint)fVar216));
              fVar240 = fVar214 * fVar208;
              auVar218 = ZEXT416((uint)fVar208);
              auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar240 * 6.0)),
                                        ZEXT416((uint)(fVar240 * fVar208)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                        ZEXT416((uint)fVar241));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar208 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar214 * fVar240)));
              fVar241 = fVar241 * 0.16666667;
              fVar214 = (auVar95._0_4_ + auVar94._0_4_) * 0.16666667;
              fVar215 = (auVar89._0_4_ + auVar86._0_4_) * 0.16666667;
              fVar216 = fVar216 * 0.16666667;
              auVar194._0_4_ = fVar216 * (float)local_6e0._0_4_;
              auVar194._4_4_ = fVar216 * (float)local_6e0._4_4_;
              auVar194._8_4_ = fVar216 * fStack_6d8;
              auVar194._12_4_ = fVar216 * fStack_6d4;
              auVar221._4_4_ = fVar215;
              auVar221._0_4_ = fVar215;
              auVar221._8_4_ = fVar215;
              auVar221._12_4_ = fVar215;
              auVar95 = vfmadd132ps_fma(auVar221,auVar194,local_6a0._0_16_);
              auVar195._4_4_ = fVar214;
              auVar195._0_4_ = fVar214;
              auVar195._8_4_ = fVar214;
              auVar195._12_4_ = fVar214;
              auVar95 = vfmadd132ps_fma(auVar195,auVar95,local_6c0._0_16_);
              auVar174._4_4_ = fVar241;
              auVar174._0_4_ = fVar241;
              auVar174._8_4_ = fVar241;
              auVar174._12_4_ = fVar241;
              auVar95 = vfmadd132ps_fma(auVar174,auVar95,local_680._0_16_);
              local_560._0_16_ = auVar95;
              auVar88 = vsubps_avx(auVar88,auVar95);
              local_740._0_16_ = auVar88;
              auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
              local_8e0._0_16_ = auVar266._0_16_;
              local_760._0_16_ = auVar88;
              if (auVar88._0_4_ < 0.0) {
                local_7e0._0_4_ = fVar239;
                local_800._0_4_ = fVar240;
                auVar242._0_4_ = sqrtf(auVar88._0_4_);
                auVar242._4_60_ = extraout_var_01;
                auVar88 = auVar242._0_16_;
                fVar240 = (float)local_800._0_4_;
                auVar95 = local_8e0._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                local_7e0._0_4_ = fVar239;
                auVar95 = auVar266._0_16_;
              }
              local_580._4_4_ = fVar208;
              local_580._0_4_ = fVar208;
              fStack_578 = fVar208;
              fStack_574 = fVar208;
              auVar89 = vfnmsub213ss_fma(auVar95,auVar95,ZEXT416((uint)(fVar240 * 4.0)));
              auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * 4.0)),auVar218,auVar218);
              fVar239 = fVar208 * -fVar208 * 0.5;
              fVar240 = auVar89._0_4_ * 0.5;
              fVar241 = auVar95._0_4_ * 0.5;
              local_7e0._0_4_ = (float)local_7e0._0_4_ * 0.5;
              auVar211._0_4_ = (float)local_7e0._0_4_ * (float)local_6e0._0_4_;
              auVar211._4_4_ = (float)local_7e0._0_4_ * (float)local_6e0._4_4_;
              auVar211._8_4_ = (float)local_7e0._0_4_ * fStack_6d8;
              auVar211._12_4_ = (float)local_7e0._0_4_ * fStack_6d4;
              auVar175._4_4_ = fVar241;
              auVar175._0_4_ = fVar241;
              auVar175._8_4_ = fVar241;
              auVar175._12_4_ = fVar241;
              auVar95 = vfmadd132ps_fma(auVar175,auVar211,local_6a0._0_16_);
              auVar196._4_4_ = fVar240;
              auVar196._0_4_ = fVar240;
              auVar196._8_4_ = fVar240;
              auVar196._12_4_ = fVar240;
              auVar95 = vfmadd132ps_fma(auVar196,auVar95,local_6c0._0_16_);
              auVar249._4_4_ = fVar239;
              auVar249._0_4_ = fVar239;
              auVar249._8_4_ = fVar239;
              auVar249._12_4_ = fVar239;
              _local_7e0 = vfmadd132ps_fma(auVar249,auVar95,local_680._0_16_);
              local_5a0._0_16_ = vdpps_avx(_local_7e0,_local_7e0,0x7f);
              auVar65._12_4_ = 0;
              auVar65._0_12_ = ZEXT812(0);
              fVar239 = local_5a0._0_4_;
              auVar89 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar239));
              local_5c0._0_16_ = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar239));
              auVar95 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_770._0_4_ = auVar95._0_4_;
              local_800._0_4_ = auVar88._0_4_;
              if (fVar239 < -fVar239) {
                local_790 = auVar89;
                auVar246._0_4_ = sqrtf(fVar239);
                auVar246._4_60_ = extraout_var_02;
                auVar88 = ZEXT416((uint)local_800._0_4_);
                auVar86 = auVar246._0_16_;
                auVar95 = local_790;
                auVar94 = _local_7e0;
              }
              else {
                auVar86 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
                auVar95 = auVar89;
                auVar94 = _local_7e0;
              }
              fVar240 = auVar95._0_4_;
              fVar239 = auVar89._0_4_ * 1.5 + fVar239 * -0.5 * fVar240 * fVar240 * fVar240;
              auVar254._0_4_ = auVar94._0_4_ * fVar239;
              auVar254._4_4_ = auVar94._4_4_ * fVar239;
              auVar254._8_4_ = auVar94._8_4_ * fVar239;
              auVar254._12_4_ = auVar94._12_4_ * fVar239;
              auVar95 = vdpps_avx(local_740._0_16_,auVar254,0x7f);
              fVar240 = auVar88._0_4_ + 1.0;
              fVar241 = auVar95._0_4_;
              auVar151._0_4_ = fVar241 * fVar241;
              auVar151._4_4_ = auVar95._4_4_ * auVar95._4_4_;
              auVar151._8_4_ = auVar95._8_4_ * auVar95._8_4_;
              auVar151._12_4_ = auVar95._12_4_ * auVar95._12_4_;
              auVar89 = vsubps_avx(local_760._0_16_,auVar151);
              fVar214 = auVar89._0_4_;
              auVar176._4_12_ = ZEXT812(0) << 0x20;
              auVar176._0_4_ = fVar214;
              auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
              auVar87 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
              auVar91 = vmulss_avx512f(auVar89,ZEXT416(0xbf000000));
              if (fVar214 < 0.0) {
                local_790._0_4_ = fVar240;
                local_630 = fVar239;
                fStack_62c = fVar239;
                fStack_628 = fVar239;
                fStack_624 = fVar239;
                local_620 = auVar254;
                local_610 = auVar90;
                fVar214 = sqrtf(fVar214);
                auVar91 = ZEXT416(auVar91._0_4_);
                auVar87 = ZEXT416(auVar87._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar88 = ZEXT416((uint)local_800._0_4_);
                auVar94 = _local_7e0;
                fVar240 = (float)local_790._0_4_;
                auVar254 = local_620;
                auVar90 = local_610;
                fVar239 = local_630;
                fVar215 = fStack_62c;
                fVar216 = fStack_628;
                fVar208 = fStack_624;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                fVar214 = auVar89._0_4_;
                fVar215 = fVar239;
                fVar216 = fVar239;
                fVar208 = fVar239;
              }
              auVar251 = ZEXT1664(auVar94);
              auVar246 = ZEXT1664(local_760._0_16_);
              auVar242 = ZEXT1664(local_740._0_16_);
              auVar263 = ZEXT3264(local_900);
              auVar255 = ZEXT3264(local_920);
              auVar256 = ZEXT3264(local_940);
              auVar257 = ZEXT3264(local_960);
              auVar258 = ZEXT3264(local_820);
              auVar259 = ZEXT3264(local_980);
              auVar260 = ZEXT3264(local_840);
              auVar261 = ZEXT3264(local_9a0);
              auVar262 = ZEXT3264(local_860);
              auVar264 = ZEXT3264(local_9c0);
              auVar265 = ZEXT3264(local_880);
              auVar267 = ZEXT3264(local_9e0);
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar218,local_8e0._0_16_);
              auVar89 = vfmadd231ss_fma(auVar218,local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
              fVar225 = local_8e0._0_4_;
              auVar197._0_4_ = fVar225 * (float)local_6e0._0_4_;
              auVar197._4_4_ = fVar225 * (float)local_6e0._4_4_;
              auVar197._8_4_ = fVar225 * fStack_6d8;
              auVar197._12_4_ = fVar225 * fStack_6d4;
              auVar212._0_4_ = auVar89._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar89 = vfmadd132ps_fma(auVar212,auVar197,local_6a0._0_16_);
              auVar177._0_4_ = auVar93._0_4_;
              auVar177._4_4_ = auVar177._0_4_;
              auVar177._8_4_ = auVar177._0_4_;
              auVar177._12_4_ = auVar177._0_4_;
              auVar89 = vfmadd132ps_fma(auVar177,auVar89,local_6c0._0_16_);
              auVar89 = vfmadd132ps_fma(_local_580,auVar89,local_680._0_16_);
              auVar178._0_4_ = auVar89._0_4_ * (float)local_5a0._0_4_;
              auVar178._4_4_ = auVar89._4_4_ * (float)local_5a0._0_4_;
              auVar178._8_4_ = auVar89._8_4_ * (float)local_5a0._0_4_;
              auVar178._12_4_ = auVar89._12_4_ * (float)local_5a0._0_4_;
              auVar89 = vdpps_avx(auVar94,auVar89,0x7f);
              fVar217 = auVar89._0_4_;
              auVar198._0_4_ = auVar94._0_4_ * fVar217;
              auVar198._4_4_ = auVar94._4_4_ * fVar217;
              auVar198._8_4_ = auVar94._8_4_ * fVar217;
              auVar198._12_4_ = auVar94._12_4_ * fVar217;
              auVar89 = vsubps_avx(auVar178,auVar198);
              fVar217 = (float)local_770._0_4_ * (float)local_5c0._0_4_;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(auVar94,auVar22);
              auVar222._0_4_ = fVar239 * auVar89._0_4_ * fVar217;
              auVar222._4_4_ = fVar215 * auVar89._4_4_ * fVar217;
              auVar222._8_4_ = fVar216 * auVar89._8_4_ * fVar217;
              auVar222._12_4_ = fVar208 * auVar89._12_4_ * fVar217;
              auVar89 = vdpps_avx(auVar92,auVar254,0x7f);
              auVar218 = vmaxss_avx(ZEXT416((uint)fVar236),
                                    ZEXT416((uint)((float)local_7c0._0_4_ * (float)local_780._0_4_))
                                   );
              auVar93 = vdivss_avx512f(ZEXT416((uint)fVar236),auVar86);
              auVar86 = vdpps_avx(local_740._0_16_,auVar222,0x7f);
              auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar236),auVar218);
              auVar93 = vfmadd213ss_fma(ZEXT416((uint)fVar240),auVar93,auVar88);
              auVar88 = vdpps_avx(local_710,auVar254,0x7f);
              fVar239 = auVar89._0_4_ + auVar86._0_4_;
              auVar89 = vdpps_avx(local_740._0_16_,auVar92,0x7f);
              auVar91 = vmulss_avx512f(auVar91,auVar90);
              auVar90 = vmulss_avx512f(auVar90,auVar90);
              auVar86 = vdpps_avx(local_740._0_16_,local_710,0x7f);
              auVar91 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar91._0_4_ * auVar90._0_4_)));
              auVar90 = vfnmadd231ss_fma(auVar89,auVar95,ZEXT416((uint)fVar239));
              auVar87 = vfnmadd231ss_fma(auVar86,auVar95,auVar88);
              auVar89 = vpermilps_avx(local_560._0_16_,0xff);
              fVar214 = fVar214 - auVar89._0_4_;
              auVar89 = vshufps_avx(auVar94,auVar94,0xff);
              auVar86 = vfmsub213ss_fma(auVar90,auVar91,auVar89);
              fVar240 = auVar87._0_4_ * auVar91._0_4_;
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar86._0_4_)),
                                        ZEXT416((uint)fVar239),ZEXT416((uint)fVar240));
              auVar235 = ZEXT1664(auVar90);
              fVar216 = auVar90._0_4_;
              fVar215 = fVar241 * (auVar86._0_4_ / fVar216);
              auVar229 = ZEXT464((uint)fVar215);
              fVar225 = fVar225 - (fVar241 * (fVar240 / fVar216) -
                                  fVar214 * (auVar88._0_4_ / fVar216));
              auVar266 = ZEXT464((uint)fVar225);
              fVar239 = (float)local_7c0._0_4_ - (fVar214 * (fVar239 / fVar216) - fVar215);
              auVar238 = ZEXT464((uint)fVar239);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar95,auVar23);
              if (auVar88._0_4_ < auVar93._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar93._0_4_ + auVar218._0_4_)),local_640,
                                          ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx512vl(ZEXT416((uint)fVar214),auVar24);
                if (auVar95._0_4_ < auVar88._0_4_) {
                  fVar240 = fVar239 + (float)local_650._0_4_;
                  if (fVar240 < fVar145) break;
                  fVar241 = *(float *)(ray + k * 4 + 0x80);
                  auVar229 = ZEXT464((uint)fVar241);
                  if (((fVar241 < fVar240) || (fVar225 < 0.0)) || (1.0 < fVar225)) break;
                  auVar199._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar199._0_4_ = local_760._0_4_;
                  auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar199);
                  fVar214 = auVar88._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar214 = fVar214 * 1.5 + local_760._0_4_ * -0.5 * fVar214 * fVar214 * fVar214;
                  auVar200._0_4_ = local_740._0_4_ * fVar214;
                  auVar200._4_4_ = local_740._4_4_ * fVar214;
                  auVar200._8_4_ = local_740._8_4_ * fVar214;
                  auVar200._12_4_ = local_740._12_4_ * fVar214;
                  auVar86 = vfmadd213ps_fma(auVar89,auVar200,auVar94);
                  auVar88 = vshufps_avx(auVar200,auVar200,0xc9);
                  auVar95 = vshufps_avx(auVar94,auVar94,0xc9);
                  auVar201._0_4_ = auVar200._0_4_ * auVar95._0_4_;
                  auVar201._4_4_ = auVar200._4_4_ * auVar95._4_4_;
                  auVar201._8_4_ = auVar200._8_4_ * auVar95._8_4_;
                  auVar201._12_4_ = auVar200._12_4_ * auVar95._12_4_;
                  auVar89 = vfmsub231ps_fma(auVar201,auVar94,auVar88);
                  auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar95 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                  auVar152._0_4_ = auVar86._0_4_ * auVar89._0_4_;
                  auVar152._4_4_ = auVar86._4_4_ * auVar89._4_4_;
                  auVar152._8_4_ = auVar86._8_4_ * auVar89._8_4_;
                  auVar152._12_4_ = auVar86._12_4_ * auVar89._12_4_;
                  auVar88 = vfmsub231ps_fma(auVar152,auVar88,auVar95);
                  uVar167 = auVar88._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar240;
                    uVar3 = vextractps_avx(auVar88,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                    uVar3 = vextractps_avx(auVar88,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar167;
                    *(float *)(ray + k * 4 + 0xf0) = fVar225;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                    *(uint *)(ray + k * 4 + 0x120) = uVar79;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_500 = (RTCHitN  [16])vshufps_avx(auVar88,auVar88,0x55);
                  auStack_4f0 = vshufps_avx(auVar88,auVar88,0xaa);
                  local_4e0 = uVar167;
                  uStack_4dc = uVar167;
                  uStack_4d8 = uVar167;
                  uStack_4d4 = uVar167;
                  local_4d0 = fVar225;
                  fStack_4cc = fVar225;
                  fStack_4c8 = fVar225;
                  fStack_4c4 = fVar225;
                  local_4c0 = ZEXT416(0) << 0x20;
                  local_4b0 = local_520._0_8_;
                  uStack_4a8 = local_520._8_8_;
                  local_4a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_48c = context->user->instID[0];
                  local_490 = uStack_48c;
                  uStack_488 = uStack_48c;
                  uStack_484 = uStack_48c;
                  uStack_480 = context->user->instPrimID[0];
                  uStack_47c = uStack_480;
                  uStack_478 = uStack_480;
                  uStack_474 = uStack_480;
                  *(float *)(ray + k * 4 + 0x80) = fVar240;
                  local_a00 = local_530;
                  local_8b0.valid = (int *)local_a00;
                  local_8b0.geometryUserPtr = pGVar4->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_500;
                  local_8b0.N = 4;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar235 = ZEXT1664(auVar90);
                    auVar238 = ZEXT464((uint)fVar239);
                    auVar242 = ZEXT1664(local_740._0_16_);
                    auVar246 = ZEXT1664(local_760._0_16_);
                    auVar251 = ZEXT1664(auVar94);
                    (*pGVar4->intersectionFilterN)(&local_8b0);
                    auVar267 = ZEXT3264(local_9e0);
                    auVar265 = ZEXT3264(local_880);
                    auVar264 = ZEXT3264(local_9c0);
                    auVar262 = ZEXT3264(local_860);
                    auVar261 = ZEXT3264(local_9a0);
                    auVar260 = ZEXT3264(local_840);
                    auVar259 = ZEXT3264(local_980);
                    auVar258 = ZEXT3264(local_820);
                    auVar257 = ZEXT3264(local_960);
                    auVar256 = ZEXT3264(local_940);
                    auVar255 = ZEXT3264(local_920);
                    auVar263 = ZEXT3264(local_900);
                  }
                  uVar83 = vptestmd_avx512vl(local_a00,local_a00);
                  if ((uVar83 & 0xf) != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      auVar251 = ZEXT1664(auVar251._0_16_);
                      (*p_Var5)(&local_8b0);
                      auVar267 = ZEXT3264(local_9e0);
                      auVar265 = ZEXT3264(local_880);
                      auVar264 = ZEXT3264(local_9c0);
                      auVar262 = ZEXT3264(local_860);
                      auVar261 = ZEXT3264(local_9a0);
                      auVar260 = ZEXT3264(local_840);
                      auVar259 = ZEXT3264(local_980);
                      auVar258 = ZEXT3264(local_820);
                      auVar257 = ZEXT3264(local_960);
                      auVar256 = ZEXT3264(local_940);
                      auVar255 = ZEXT3264(local_920);
                      auVar263 = ZEXT3264(local_900);
                    }
                    auVar229 = ZEXT464((uint)fVar241);
                    uVar83 = vptestmd_avx512vl(local_a00,local_a00);
                    uVar83 = uVar83 & 0xf;
                    bVar82 = (byte)uVar83;
                    if (bVar82 != 0) {
                      iVar66 = *(int *)(local_8b0.hit + 4);
                      iVar67 = *(int *)(local_8b0.hit + 8);
                      iVar68 = *(int *)(local_8b0.hit + 0xc);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xc0) =
                           (uint)(bVar82 & 1) * *(int *)local_8b0.hit |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xc0);
                      *(uint *)(local_8b0.ray + 0xc4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xc4);
                      *(uint *)(local_8b0.ray + 200) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 200);
                      *(uint *)(local_8b0.ray + 0xcc) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xcc);
                      iVar66 = *(int *)(local_8b0.hit + 0x14);
                      iVar67 = *(int *)(local_8b0.hit + 0x18);
                      iVar68 = *(int *)(local_8b0.hit + 0x1c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xd0) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x10) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xd0);
                      *(uint *)(local_8b0.ray + 0xd4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xd4);
                      *(uint *)(local_8b0.ray + 0xd8) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0xd8);
                      *(uint *)(local_8b0.ray + 0xdc) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xdc);
                      iVar66 = *(int *)(local_8b0.hit + 0x24);
                      iVar67 = *(int *)(local_8b0.hit + 0x28);
                      iVar68 = *(int *)(local_8b0.hit + 0x2c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xe0) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x20) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xe0);
                      *(uint *)(local_8b0.ray + 0xe4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xe4);
                      *(uint *)(local_8b0.ray + 0xe8) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0xe8);
                      *(uint *)(local_8b0.ray + 0xec) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xec);
                      iVar66 = *(int *)(local_8b0.hit + 0x34);
                      iVar67 = *(int *)(local_8b0.hit + 0x38);
                      iVar68 = *(int *)(local_8b0.hit + 0x3c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0xf0) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x30) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0xf0);
                      *(uint *)(local_8b0.ray + 0xf4) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0xf4);
                      *(uint *)(local_8b0.ray + 0xf8) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0xf8);
                      *(uint *)(local_8b0.ray + 0xfc) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0xfc);
                      iVar66 = *(int *)(local_8b0.hit + 0x44);
                      iVar67 = *(int *)(local_8b0.hit + 0x48);
                      iVar68 = *(int *)(local_8b0.hit + 0x4c);
                      bVar6 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar8 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_8b0.ray + 0x100) =
                           (uint)(bVar82 & 1) * *(int *)(local_8b0.hit + 0x40) |
                           (uint)!(bool)(bVar82 & 1) * *(int *)(local_8b0.ray + 0x100);
                      *(uint *)(local_8b0.ray + 0x104) =
                           (uint)bVar6 * iVar66 | (uint)!bVar6 * *(int *)(local_8b0.ray + 0x104);
                      *(uint *)(local_8b0.ray + 0x108) =
                           (uint)bVar7 * iVar67 | (uint)!bVar7 * *(int *)(local_8b0.ray + 0x108);
                      *(uint *)(local_8b0.ray + 0x10c) =
                           (uint)bVar8 * iVar68 | (uint)!bVar8 * *(int *)(local_8b0.ray + 0x10c);
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x50));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x110) = auVar88;
                      auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x60));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x120) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x70));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x130) = auVar88;
                      auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_8b0.hit + 0x80));
                      *(undefined1 (*) [16])(local_8b0.ray + 0x140) = auVar88;
                      break;
                    }
                  }
                  auVar229 = ZEXT464((uint)fVar241);
                  *(float *)(ray + k * 4 + 0x80) = fVar241;
                  break;
                }
              }
              lVar81 = lVar81 + -1;
            } while (lVar81 != 0);
            uVar167 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar159._4_4_ = uVar167;
            auVar159._0_4_ = uVar167;
            auVar159._8_4_ = uVar167;
            auVar159._12_4_ = uVar167;
            auVar159._16_4_ = uVar167;
            auVar159._20_4_ = uVar167;
            auVar159._24_4_ = uVar167;
            auVar159._28_4_ = uVar167;
            auVar70._4_4_ = fStack_3dc;
            auVar70._0_4_ = local_3e0;
            auVar70._8_4_ = fStack_3d8;
            auVar70._12_4_ = fStack_3d4;
            auVar70._16_4_ = fStack_3d0;
            auVar70._20_4_ = fStack_3cc;
            auVar70._24_4_ = fStack_3c8;
            auVar70._28_4_ = fStack_3c4;
            uVar14 = vcmpps_avx512vl(auVar159,auVar70,0xd);
            bVar80 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar80 & (byte)uVar14;
          } while (bVar80 != 0);
          auVar135 = local_400;
          fVar236 = (float)local_700._0_4_;
          fVar239 = (float)local_700._4_4_;
          fVar240 = fStack_6f8;
          fVar241 = fStack_6f4;
          fVar214 = fStack_6f0;
          fVar215 = fStack_6ec;
          fVar216 = fStack_6e8;
          fVar208 = fStack_6e4;
        }
        uVar16 = vpcmpgtd_avx512vl(auVar135,local_3a0);
        uVar17 = vpcmpd_avx512vl(local_3a0,local_320,1);
        auVar203._0_4_ = fVar236 + (float)local_200._0_4_;
        auVar203._4_4_ = fVar239 + (float)local_200._4_4_;
        auVar203._8_4_ = fVar240 + fStack_1f8;
        auVar203._12_4_ = fVar241 + fStack_1f4;
        auVar203._16_4_ = fVar214 + fStack_1f0;
        auVar203._20_4_ = fVar215 + fStack_1ec;
        auVar203._24_4_ = fVar216 + fStack_1e8;
        auVar203._28_4_ = fVar208 + fStack_1e4;
        uVar14 = vcmpps_avx512vl(auVar203,auVar159,2);
        bVar77 = bVar77 & (byte)uVar17 & (byte)uVar14;
        auVar204._0_4_ = fVar236 + local_380._0_4_;
        auVar204._4_4_ = fVar239 + local_380._4_4_;
        auVar204._8_4_ = fVar240 + local_380._8_4_;
        auVar204._12_4_ = fVar241 + local_380._12_4_;
        auVar204._16_4_ = fVar214 + local_380._16_4_;
        auVar204._20_4_ = fVar215 + local_380._20_4_;
        auVar204._24_4_ = fVar216 + local_380._24_4_;
        auVar204._28_4_ = fVar208 + local_380._28_4_;
        uVar14 = vcmpps_avx512vl(auVar204,auVar159,2);
        bVar73 = bVar73 & (byte)uVar16 & (byte)uVar14 | bVar77;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar266 = ZEXT3264(auVar101);
        pPVar78 = local_5f8;
        prim = local_5f0;
        if (bVar73 != 0) {
          abStack_180[uVar75 * 0x60] = bVar73;
          auVar137._0_4_ =
               (uint)(bVar77 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar77 & 1) * (int)local_380._0_4_;
          bVar6 = (bool)(bVar77 >> 1 & 1);
          auVar137._4_4_ = (uint)bVar6 * local_200._4_4_ | (uint)!bVar6 * (int)local_380._4_4_;
          bVar6 = (bool)(bVar77 >> 2 & 1);
          auVar137._8_4_ = (uint)bVar6 * (int)fStack_1f8 | (uint)!bVar6 * (int)local_380._8_4_;
          bVar6 = (bool)(bVar77 >> 3 & 1);
          auVar137._12_4_ = (uint)bVar6 * (int)fStack_1f4 | (uint)!bVar6 * (int)local_380._12_4_;
          bVar6 = (bool)(bVar77 >> 4 & 1);
          auVar137._16_4_ = (uint)bVar6 * (int)fStack_1f0 | (uint)!bVar6 * (int)local_380._16_4_;
          bVar6 = (bool)(bVar77 >> 5 & 1);
          auVar137._20_4_ = (uint)bVar6 * (int)fStack_1ec | (uint)!bVar6 * (int)local_380._20_4_;
          auVar137._24_4_ =
               (uint)(bVar77 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar77 >> 6) * (int)local_380._24_4_;
          auVar137._28_4_ = local_380._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar137;
          uVar83 = vmovlps_avx(local_3b0);
          (&uStack_140)[uVar75 * 0xc] = uVar83;
          aiStack_138[uVar75 * 0x18] = local_9ec + 1;
          uVar75 = (ulong)((int)uVar75 + 1);
        }
      }
    }
    do {
      uVar85 = (uint)uVar75;
      uVar75 = (ulong)(uVar85 - 1);
      if (uVar85 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar35._4_4_ = uVar1;
        auVar35._0_4_ = uVar1;
        auVar35._8_4_ = uVar1;
        auVar35._12_4_ = uVar1;
        auVar35._16_4_ = uVar1;
        auVar35._20_4_ = uVar1;
        auVar35._24_4_ = uVar1;
        auVar35._28_4_ = uVar1;
        uVar14 = vcmpps_avx512vl(local_300,auVar35,2);
        uVar79 = (uint)local_5e8 & (uint)uVar14;
        local_5e8 = (ulong)uVar79;
        if (uVar79 == 0) {
          return;
        }
        goto LAB_01ca3ddb;
      }
      lVar81 = uVar75 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar81);
      auVar179._0_4_ = fVar236 + auVar101._0_4_;
      auVar179._4_4_ = fVar239 + auVar101._4_4_;
      auVar179._8_4_ = fVar240 + auVar101._8_4_;
      auVar179._12_4_ = fVar241 + auVar101._12_4_;
      auVar179._16_4_ = fVar214 + auVar101._16_4_;
      auVar179._20_4_ = fVar215 + auVar101._20_4_;
      auVar179._24_4_ = fVar216 + auVar101._24_4_;
      auVar179._28_4_ = fVar208 + auVar101._28_4_;
      uVar167 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar34._4_4_ = uVar167;
      auVar34._0_4_ = uVar167;
      auVar34._8_4_ = uVar167;
      auVar34._12_4_ = uVar167;
      auVar34._16_4_ = uVar167;
      auVar34._20_4_ = uVar167;
      auVar34._24_4_ = uVar167;
      auVar34._28_4_ = uVar167;
      uVar14 = vcmpps_avx512vl(auVar179,auVar34,2);
      uVar84 = (uint)uVar14 & (uint)abStack_180[lVar81];
    } while (uVar84 == 0);
    uVar83 = (&uStack_140)[uVar75 * 0xc];
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar83;
    auVar202._8_4_ = 0x7f800000;
    auVar202._0_8_ = 0x7f8000007f800000;
    auVar202._12_4_ = 0x7f800000;
    auVar202._16_4_ = 0x7f800000;
    auVar202._20_4_ = 0x7f800000;
    auVar202._24_4_ = 0x7f800000;
    auVar202._28_4_ = 0x7f800000;
    auVar99 = vblendmps_avx512vl(auVar202,auVar101);
    bVar73 = (byte)uVar84;
    auVar133._0_4_ =
         (uint)(bVar73 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)auVar101._0_4_;
    bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
    auVar133._4_4_ = (uint)bVar6 * auVar99._4_4_ | (uint)!bVar6 * (int)auVar101._4_4_;
    bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
    auVar133._8_4_ = (uint)bVar6 * auVar99._8_4_ | (uint)!bVar6 * (int)auVar101._8_4_;
    bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
    auVar133._12_4_ = (uint)bVar6 * auVar99._12_4_ | (uint)!bVar6 * (int)auVar101._12_4_;
    bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
    auVar133._16_4_ = (uint)bVar6 * auVar99._16_4_ | (uint)!bVar6 * (int)auVar101._16_4_;
    bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
    auVar133._20_4_ = (uint)bVar6 * auVar99._20_4_ | (uint)!bVar6 * (int)auVar101._20_4_;
    bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
    auVar133._24_4_ = (uint)bVar6 * auVar99._24_4_ | (uint)!bVar6 * (int)auVar101._24_4_;
    auVar133._28_4_ =
         (uVar84 >> 7) * auVar99._28_4_ | (uint)!SUB41(uVar84 >> 7,0) * (int)auVar101._28_4_;
    auVar101 = vshufps_avx(auVar133,auVar133,0xb1);
    auVar101 = vminps_avx(auVar133,auVar101);
    auVar99 = vshufpd_avx(auVar101,auVar101,5);
    auVar101 = vminps_avx(auVar101,auVar99);
    auVar99 = vpermpd_avx2(auVar101,0x4e);
    auVar101 = vminps_avx(auVar101,auVar99);
    uVar14 = vcmpps_avx512vl(auVar133,auVar101,0);
    bVar77 = (byte)uVar14 & bVar73;
    if (bVar77 != 0) {
      uVar84 = (uint)bVar77;
    }
    uVar138 = 0;
    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
      uVar138 = uVar138 + 1;
    }
    local_9ec = aiStack_138[uVar75 * 0x18];
    bVar73 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar73;
    abStack_180[lVar81] = bVar73;
    if (bVar73 == 0) {
      uVar85 = uVar85 - 1;
    }
    uVar167 = (undefined4)uVar83;
    auVar155._4_4_ = uVar167;
    auVar155._0_4_ = uVar167;
    auVar155._8_4_ = uVar167;
    auVar155._12_4_ = uVar167;
    auVar155._16_4_ = uVar167;
    auVar155._20_4_ = uVar167;
    auVar155._24_4_ = uVar167;
    auVar155._28_4_ = uVar167;
    auVar88 = vmovshdup_avx(auVar168);
    auVar88 = vsubps_avx(auVar88,auVar168);
    auVar180._0_4_ = auVar88._0_4_;
    auVar180._4_4_ = auVar180._0_4_;
    auVar180._8_4_ = auVar180._0_4_;
    auVar180._12_4_ = auVar180._0_4_;
    auVar180._16_4_ = auVar180._0_4_;
    auVar180._20_4_ = auVar180._0_4_;
    auVar180._24_4_ = auVar180._0_4_;
    auVar180._28_4_ = auVar180._0_4_;
    auVar88 = vfmadd132ps_fma(auVar180,auVar155,_DAT_01faff20);
    _local_500 = ZEXT1632(auVar88);
    local_3b0._8_8_ = 0;
    local_3b0._0_8_ = *(ulong *)(local_500 + (ulong)uVar138 * 4);
    uVar75 = (ulong)uVar85;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }